

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  uint uVar46;
  ulong uVar47;
  long lVar48;
  byte bVar49;
  uint uVar50;
  uint uVar51;
  ulong uVar52;
  ulong uVar53;
  uint uVar54;
  float fVar55;
  undefined4 uVar56;
  float fVar57;
  float fVar58;
  float fVar81;
  float fVar82;
  vint4 bi_2;
  float fVar83;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar84;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined8 uVar85;
  vint4 bi_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 extraout_var [56];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  vint4 ai_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar142;
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar174;
  float fVar175;
  vfloat4 b0_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar176;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  float fVar177;
  float fVar190;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar181 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar191;
  undefined1 auVar189 [32];
  float fVar195;
  float fVar206;
  vint4 ai_1;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar207;
  float fVar222;
  vfloat4 a0_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar223;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  vfloat4 a0_3;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar243;
  float fVar255;
  float fVar256;
  vfloat4 a0_1;
  undefined1 auVar244 [16];
  float fVar257;
  undefined1 auVar245 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar246 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  vfloat4 a0;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5e8 [8];
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined1 local_538 [32];
  undefined1 local_518 [16];
  undefined1 (*local_500) [16];
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 auStack_4e8 [16];
  undefined1 local_4d8 [32];
  RTCFilterFunctionNArguments local_4b8;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  uint auStack_3c8 [4];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 auStack_3a8 [16];
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  undefined1 auVar282 [32];
  
  PVar3 = prim[1];
  uVar52 = (ulong)(byte)PVar3;
  fVar55 = *(float *)(prim + uVar52 * 0x19 + 0x12);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar128 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar128 = vinsertps_avx(auVar128,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar102 = vsubps_avx(auVar102,*(undefined1 (*) [16])(prim + uVar52 * 0x19 + 6));
  auVar239._0_4_ = fVar55 * auVar102._0_4_;
  auVar239._4_4_ = fVar55 * auVar102._4_4_;
  auVar239._8_4_ = fVar55 * auVar102._8_4_;
  auVar239._12_4_ = fVar55 * auVar102._12_4_;
  auVar122._0_4_ = fVar55 * auVar128._0_4_;
  auVar122._4_4_ = fVar55 * auVar128._4_4_;
  auVar122._8_4_ = fVar55 * auVar128._8_4_;
  auVar122._12_4_ = fVar55 * auVar128._12_4_;
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 4 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 5 + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 6 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar52 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar47 = (ulong)(uint)((int)(uVar52 * 9) * 2);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 + uVar52 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  uVar47 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar269._4_4_ = auVar122._0_4_;
  auVar269._0_4_ = auVar122._0_4_;
  auVar269._8_4_ = auVar122._0_4_;
  auVar269._12_4_ = auVar122._0_4_;
  auVar87 = vshufps_avx(auVar122,auVar122,0x55);
  auVar59 = vshufps_avx(auVar122,auVar122,0xaa);
  fVar55 = auVar59._0_4_;
  auVar237._0_4_ = fVar55 * auVar125._0_4_;
  fVar58 = auVar59._4_4_;
  auVar237._4_4_ = fVar58 * auVar125._4_4_;
  fVar82 = auVar59._8_4_;
  auVar237._8_4_ = fVar82 * auVar125._8_4_;
  fVar83 = auVar59._12_4_;
  auVar237._12_4_ = fVar83 * auVar125._12_4_;
  auVar224._0_4_ = auVar12._0_4_ * fVar55;
  auVar224._4_4_ = auVar12._4_4_ * fVar58;
  auVar224._8_4_ = auVar12._8_4_ * fVar82;
  auVar224._12_4_ = auVar12._12_4_ * fVar83;
  auVar196._0_4_ = auVar107._0_4_ * fVar55;
  auVar196._4_4_ = auVar107._4_4_ * fVar58;
  auVar196._8_4_ = auVar107._8_4_ * fVar82;
  auVar196._12_4_ = auVar107._12_4_ * fVar83;
  auVar59 = vfmadd231ps_fma(auVar237,auVar87,auVar128);
  auVar88 = vfmadd231ps_fma(auVar224,auVar87,auVar11);
  auVar87 = vfmadd231ps_fma(auVar196,auVar60,auVar87);
  auVar118 = vfmadd231ps_fma(auVar59,auVar269,auVar102);
  auVar88 = vfmadd231ps_fma(auVar88,auVar269,auVar10);
  auVar133 = vfmadd231ps_fma(auVar87,auVar61,auVar269);
  auVar270._4_4_ = auVar239._0_4_;
  auVar270._0_4_ = auVar239._0_4_;
  auVar270._8_4_ = auVar239._0_4_;
  auVar270._12_4_ = auVar239._0_4_;
  auVar87 = vshufps_avx(auVar239,auVar239,0x55);
  auVar59 = vshufps_avx(auVar239,auVar239,0xaa);
  fVar55 = auVar59._0_4_;
  auVar143._0_4_ = fVar55 * auVar125._0_4_;
  fVar58 = auVar59._4_4_;
  auVar143._4_4_ = fVar58 * auVar125._4_4_;
  fVar82 = auVar59._8_4_;
  auVar143._8_4_ = fVar82 * auVar125._8_4_;
  fVar83 = auVar59._12_4_;
  auVar143._12_4_ = fVar83 * auVar125._12_4_;
  auVar86._0_4_ = auVar12._0_4_ * fVar55;
  auVar86._4_4_ = auVar12._4_4_ * fVar58;
  auVar86._8_4_ = auVar12._8_4_ * fVar82;
  auVar86._12_4_ = auVar12._12_4_ * fVar83;
  auVar59._0_4_ = auVar107._0_4_ * fVar55;
  auVar59._4_4_ = auVar107._4_4_ * fVar58;
  auVar59._8_4_ = auVar107._8_4_ * fVar82;
  auVar59._12_4_ = auVar107._12_4_ * fVar83;
  auVar128 = vfmadd231ps_fma(auVar143,auVar87,auVar128);
  auVar125 = vfmadd231ps_fma(auVar86,auVar87,auVar11);
  auVar11 = vfmadd231ps_fma(auVar59,auVar87,auVar60);
  auVar12 = vfmadd231ps_fma(auVar128,auVar270,auVar102);
  auVar60 = vfmadd231ps_fma(auVar125,auVar270,auVar10);
  auVar107 = vfmadd231ps_fma(auVar11,auVar270,auVar61);
  local_3f8._8_4_ = 0x7fffffff;
  local_3f8._0_8_ = 0x7fffffff7fffffff;
  local_3f8._12_4_ = 0x7fffffff;
  auVar102 = vandps_avx(auVar118,local_3f8);
  auVar132._8_4_ = 0x219392ef;
  auVar132._0_8_ = 0x219392ef219392ef;
  auVar132._12_4_ = 0x219392ef;
  auVar102 = vcmpps_avx(auVar102,auVar132,1);
  auVar128 = vblendvps_avx(auVar118,auVar132,auVar102);
  auVar102 = vandps_avx(auVar88,local_3f8);
  auVar102 = vcmpps_avx(auVar102,auVar132,1);
  auVar125 = vblendvps_avx(auVar88,auVar132,auVar102);
  auVar102 = vandps_avx(auVar133,local_3f8);
  auVar102 = vcmpps_avx(auVar102,auVar132,1);
  auVar102 = vblendvps_avx(auVar133,auVar132,auVar102);
  auVar10 = vrcpps_avx(auVar128);
  auVar178._8_4_ = 0x3f800000;
  auVar178._0_8_ = 0x3f8000003f800000;
  auVar178._12_4_ = 0x3f800000;
  auVar128 = vfnmadd213ps_fma(auVar128,auVar10,auVar178);
  auVar10 = vfmadd132ps_fma(auVar128,auVar10,auVar10);
  auVar128 = vrcpps_avx(auVar125);
  auVar125 = vfnmadd213ps_fma(auVar125,auVar128,auVar178);
  auVar11 = vfmadd132ps_fma(auVar125,auVar128,auVar128);
  auVar128 = vrcpps_avx(auVar102);
  auVar102 = vfnmadd213ps_fma(auVar102,auVar128,auVar178);
  auVar61 = vfmadd132ps_fma(auVar102,auVar128,auVar128);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar52 * 7 + 6);
  auVar102 = vpmovsxwd_avx(auVar102);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar12);
  auVar133._0_4_ = auVar10._0_4_ * auVar102._0_4_;
  auVar133._4_4_ = auVar10._4_4_ * auVar102._4_4_;
  auVar133._8_4_ = auVar10._8_4_ * auVar102._8_4_;
  auVar133._12_4_ = auVar10._12_4_ * auVar102._12_4_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar52 * 9 + 6);
  auVar102 = vpmovsxwd_avx(auVar128);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar12);
  auVar144._0_4_ = auVar10._0_4_ * auVar102._0_4_;
  auVar144._4_4_ = auVar10._4_4_ * auVar102._4_4_;
  auVar144._8_4_ = auVar10._8_4_ * auVar102._8_4_;
  auVar144._12_4_ = auVar10._12_4_ * auVar102._12_4_;
  auVar88._1_3_ = 0;
  auVar88[0] = PVar3;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar128 = vpmovsxwd_avx(auVar125);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar52 * -2 + 6);
  auVar102 = vpmovsxwd_avx(auVar10);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar60);
  auVar197._0_4_ = auVar102._0_4_ * auVar11._0_4_;
  auVar197._4_4_ = auVar102._4_4_ * auVar11._4_4_;
  auVar197._8_4_ = auVar102._8_4_ * auVar11._8_4_;
  auVar197._12_4_ = auVar102._12_4_ * auVar11._12_4_;
  auVar102 = vcvtdq2ps_avx(auVar128);
  auVar102 = vsubps_avx(auVar102,auVar60);
  auVar87._0_4_ = auVar11._0_4_ * auVar102._0_4_;
  auVar87._4_4_ = auVar11._4_4_ * auVar102._4_4_;
  auVar87._8_4_ = auVar11._8_4_ * auVar102._8_4_;
  auVar87._12_4_ = auVar11._12_4_ * auVar102._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar47 + uVar52 + 6);
  auVar102 = vpmovsxwd_avx(auVar11);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar107);
  auVar118._0_4_ = auVar61._0_4_ * auVar102._0_4_;
  auVar118._4_4_ = auVar61._4_4_ * auVar102._4_4_;
  auVar118._8_4_ = auVar61._8_4_ * auVar102._8_4_;
  auVar118._12_4_ = auVar61._12_4_ * auVar102._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar52 * 0x17 + 6);
  auVar102 = vpmovsxwd_avx(auVar12);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar107);
  auVar60._0_4_ = auVar61._0_4_ * auVar102._0_4_;
  auVar60._4_4_ = auVar61._4_4_ * auVar102._4_4_;
  auVar60._8_4_ = auVar61._8_4_ * auVar102._8_4_;
  auVar60._12_4_ = auVar61._12_4_ * auVar102._12_4_;
  auVar102 = vpminsd_avx(auVar133,auVar144);
  auVar128 = vpminsd_avx(auVar197,auVar87);
  auVar102 = vmaxps_avx(auVar102,auVar128);
  auVar128 = vpminsd_avx(auVar118,auVar60);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar208._4_4_ = uVar56;
  auVar208._0_4_ = uVar56;
  auVar208._8_4_ = uVar56;
  auVar208._12_4_ = uVar56;
  auVar128 = vmaxps_avx(auVar128,auVar208);
  auVar102 = vmaxps_avx(auVar102,auVar128);
  local_378._0_4_ = auVar102._0_4_ * 0.99999964;
  local_378._4_4_ = auVar102._4_4_ * 0.99999964;
  local_378._8_4_ = auVar102._8_4_ * 0.99999964;
  local_378._12_4_ = auVar102._12_4_ * 0.99999964;
  auVar102 = vpmaxsd_avx(auVar133,auVar144);
  auVar128 = vpmaxsd_avx(auVar197,auVar87);
  auVar102 = vminps_avx(auVar102,auVar128);
  auVar128 = vpmaxsd_avx(auVar118,auVar60);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar107._4_4_ = uVar56;
  auVar107._0_4_ = uVar56;
  auVar107._8_4_ = uVar56;
  auVar107._12_4_ = uVar56;
  auVar128 = vminps_avx(auVar128,auVar107);
  auVar102 = vminps_avx(auVar102,auVar128);
  auVar61._0_4_ = auVar102._0_4_ * 1.0000004;
  auVar61._4_4_ = auVar102._4_4_ * 1.0000004;
  auVar61._8_4_ = auVar102._8_4_ * 1.0000004;
  auVar61._12_4_ = auVar102._12_4_ * 1.0000004;
  auVar88[4] = PVar3;
  auVar88._5_3_ = 0;
  auVar88[8] = PVar3;
  auVar88._9_3_ = 0;
  auVar88[0xc] = PVar3;
  auVar88._13_3_ = 0;
  auVar128 = vpcmpgtd_avx(auVar88,_DAT_01f7fcf0);
  auVar102 = vcmpps_avx(local_378,auVar61,2);
  auVar102 = vandps_avx(auVar102,auVar128);
  uVar46 = vmovmskps_avx(auVar102);
  if (uVar46 == 0) {
    return;
  }
  uVar46 = uVar46 & 0xff;
  auVar78._16_16_ = mm_lookupmask_ps._240_16_;
  auVar78._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar78,ZEXT832(0) << 0x20,0x80);
  local_500 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  do {
    lVar48 = 0;
    uVar52 = (ulong)uVar46;
    for (uVar47 = uVar52; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
      lVar48 = lVar48 + 1;
    }
    uVar46 = *(uint *)(prim + 2);
    uVar4 = *(uint *)(prim + lVar48 * 4 + 6);
    pGVar5 = (context->scene->geometries).items[uVar46].ptr;
    uVar47 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                             pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)uVar4);
    p_Var6 = pGVar5[1].intersectionFilterN;
    pvVar7 = pGVar5[2].userPtr;
    _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar12 = *(undefined1 (*) [16])(_Var8 + uVar47 * (long)pvVar7);
    auVar102 = *(undefined1 (*) [16])(_Var8 + (uVar47 + 1) * (long)pvVar7);
    auVar128 = *(undefined1 (*) [16])(_Var8 + (uVar47 + 2) * (long)pvVar7);
    pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar47 + 3));
    fVar55 = *pfVar1;
    fVar58 = pfVar1[1];
    fVar82 = pfVar1[2];
    fVar83 = pfVar1[3];
    lVar48 = *(long *)&pGVar5[1].time_range.upper;
    auVar125 = *(undefined1 (*) [16])(lVar48 + (long)p_Var6 * uVar47);
    auVar10 = *(undefined1 (*) [16])(lVar48 + (long)p_Var6 * (uVar47 + 1));
    auVar11 = *(undefined1 (*) [16])(lVar48 + (long)p_Var6 * (uVar47 + 2));
    uVar52 = uVar52 - 1 & uVar52;
    pfVar1 = (float *)(lVar48 + (long)p_Var6 * (uVar47 + 3));
    fVar157 = *pfVar1;
    fVar174 = pfVar1[1];
    fVar175 = pfVar1[2];
    fVar176 = pfVar1[3];
    if (uVar52 != 0) {
      uVar53 = uVar52 - 1 & uVar52;
      for (uVar47 = uVar52; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
      }
      if (uVar53 != 0) {
        for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar61 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar277._8_4_ = 0x80000000;
    auVar277._0_8_ = 0x8000000080000000;
    auVar277._12_4_ = 0x80000000;
    auVar119._0_4_ = fVar157 * -0.0;
    auVar119._4_4_ = fVar174 * -0.0;
    auVar119._8_4_ = fVar175 * -0.0;
    auVar119._12_4_ = fVar176 * -0.0;
    auVar60 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar119);
    auVar62._0_4_ = auVar10._0_4_ + auVar60._0_4_;
    auVar62._4_4_ = auVar10._4_4_ + auVar60._4_4_;
    auVar62._8_4_ = auVar10._8_4_ + auVar60._8_4_;
    auVar62._12_4_ = auVar10._12_4_ + auVar60._12_4_;
    auVar107 = vfmadd231ps_fma(auVar62,auVar125,auVar277);
    auVar89._12_4_ = 0;
    auVar89._0_12_ = ZEXT812(0);
    auVar89 = auVar89 << 0x20;
    auVar108._0_4_ = fVar157 * 0.0;
    auVar108._4_4_ = fVar174 * 0.0;
    auVar108._8_4_ = fVar175 * 0.0;
    auVar108._12_4_ = fVar176 * 0.0;
    auVar198._8_4_ = 0x3f000000;
    auVar198._0_8_ = 0x3f0000003f000000;
    auVar198._12_4_ = 0x3f000000;
    auVar60 = vfmadd231ps_fma(auVar108,auVar11,auVar198);
    auVar60 = vfmadd231ps_fma(auVar60,auVar10,auVar89);
    auVar88 = vfnmadd231ps_fma(auVar60,auVar125,auVar198);
    auVar271._0_4_ = fVar55 * -0.0;
    auVar271._4_4_ = fVar58 * -0.0;
    auVar271._8_4_ = fVar82 * -0.0;
    auVar271._12_4_ = fVar83 * -0.0;
    auVar60 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar128,auVar271);
    auVar258._0_4_ = auVar102._0_4_ + auVar60._0_4_;
    auVar258._4_4_ = auVar102._4_4_ + auVar60._4_4_;
    auVar258._8_4_ = auVar102._8_4_ + auVar60._8_4_;
    auVar258._12_4_ = auVar102._12_4_ + auVar60._12_4_;
    auVar60 = vfmadd231ps_fma(auVar258,auVar12,auVar277);
    auVar244._0_4_ = fVar55 * 0.0;
    auVar244._4_4_ = fVar58 * 0.0;
    auVar244._8_4_ = fVar82 * 0.0;
    auVar244._12_4_ = fVar83 * 0.0;
    auVar87 = vfmadd231ps_fma(auVar244,auVar128,auVar198);
    auVar87 = vfmadd231ps_fma(auVar87,auVar102,auVar89);
    auVar118 = vfnmadd231ps_fma(auVar87,auVar12,auVar198);
    auVar120._0_4_ = auVar11._0_4_ + auVar119._0_4_;
    auVar120._4_4_ = auVar11._4_4_ + auVar119._4_4_;
    auVar120._8_4_ = auVar11._8_4_ + auVar119._8_4_;
    auVar120._12_4_ = auVar11._12_4_ + auVar119._12_4_;
    auVar87 = vfmadd231ps_fma(auVar120,auVar10,auVar89);
    auVar87 = vfmadd231ps_fma(auVar87,auVar125,auVar277);
    auVar134._0_4_ = fVar157 * 0.5;
    auVar134._4_4_ = fVar174 * 0.5;
    auVar134._8_4_ = fVar175 * 0.5;
    auVar134._12_4_ = fVar176 * 0.5;
    auVar11 = vfmadd231ps_fma(auVar134,auVar89,auVar11);
    auVar10 = vfnmadd231ps_fma(auVar11,auVar198,auVar10);
    auVar59 = vfmadd231ps_fma(auVar10,auVar89,auVar125);
    auVar209._0_4_ = auVar271._0_4_ + auVar128._0_4_;
    auVar209._4_4_ = auVar271._4_4_ + auVar128._4_4_;
    auVar209._8_4_ = auVar271._8_4_ + auVar128._8_4_;
    auVar209._12_4_ = auVar271._12_4_ + auVar128._12_4_;
    auVar125 = vfmadd231ps_fma(auVar209,auVar102,auVar89);
    auVar11 = vfmadd231ps_fma(auVar125,auVar12,auVar277);
    auVar225._0_4_ = fVar55 * 0.5;
    auVar225._4_4_ = fVar58 * 0.5;
    auVar225._8_4_ = fVar82 * 0.5;
    auVar225._12_4_ = fVar83 * 0.5;
    auVar128 = vfmadd231ps_fma(auVar225,auVar89,auVar128);
    auVar102 = vfnmadd231ps_fma(auVar128,auVar198,auVar102);
    auVar12 = vfmadd231ps_fma(auVar102,auVar89,auVar12);
    auVar102 = vshufps_avx(auVar88,auVar88,0xc9);
    auVar128 = vshufps_avx(auVar60,auVar60,0xc9);
    fVar117 = auVar88._0_4_;
    auVar158._0_4_ = fVar117 * auVar128._0_4_;
    fVar81 = auVar88._4_4_;
    auVar158._4_4_ = fVar81 * auVar128._4_4_;
    fVar57 = auVar88._8_4_;
    auVar158._8_4_ = fVar57 * auVar128._8_4_;
    fVar84 = auVar88._12_4_;
    auVar158._12_4_ = fVar84 * auVar128._12_4_;
    auVar128 = vfmsub231ps_fma(auVar158,auVar102,auVar60);
    auVar125 = vshufps_avx(auVar128,auVar128,0xc9);
    auVar128 = vshufps_avx(auVar118,auVar118,0xc9);
    auVar159._0_4_ = fVar117 * auVar128._0_4_;
    auVar159._4_4_ = fVar81 * auVar128._4_4_;
    auVar159._8_4_ = fVar57 * auVar128._8_4_;
    auVar159._12_4_ = fVar84 * auVar128._12_4_;
    auVar102 = vfmsub231ps_fma(auVar159,auVar102,auVar118);
    auVar10 = vshufps_avx(auVar102,auVar102,0xc9);
    auVar102 = vshufps_avx(auVar59,auVar59,0xc9);
    auVar128 = vshufps_avx(auVar11,auVar11,0xc9);
    fVar177 = auVar59._0_4_;
    auVar145._0_4_ = fVar177 * auVar128._0_4_;
    fVar223 = auVar59._4_4_;
    auVar145._4_4_ = fVar223 * auVar128._4_4_;
    fVar131 = auVar59._8_4_;
    auVar145._8_4_ = fVar131 * auVar128._8_4_;
    fVar142 = auVar59._12_4_;
    auVar145._12_4_ = fVar142 * auVar128._12_4_;
    auVar128 = vfmsub231ps_fma(auVar145,auVar102,auVar11);
    auVar11 = vshufps_avx(auVar128,auVar128,0xc9);
    auVar128 = vshufps_avx(auVar12,auVar12,0xc9);
    auVar179._0_4_ = fVar177 * auVar128._0_4_;
    auVar179._4_4_ = fVar223 * auVar128._4_4_;
    auVar179._8_4_ = fVar131 * auVar128._8_4_;
    auVar179._12_4_ = fVar142 * auVar128._12_4_;
    auVar128 = vfmsub231ps_fma(auVar179,auVar102,auVar12);
    auVar102 = vdpps_avx(auVar125,auVar125,0x7f);
    auVar12 = vshufps_avx(auVar128,auVar128,0xc9);
    fVar58 = auVar102._0_4_;
    auVar60 = ZEXT416((uint)fVar58);
    auVar128 = vrsqrtss_avx(auVar60,auVar60);
    fVar55 = auVar128._0_4_;
    auVar128 = vdpps_avx(auVar125,auVar10,0x7f);
    fVar55 = fVar55 * 1.5 + fVar58 * -0.5 * fVar55 * fVar55 * fVar55;
    fVar157 = auVar125._0_4_ * fVar55;
    fVar174 = auVar125._4_4_ * fVar55;
    fVar175 = auVar125._8_4_ * fVar55;
    fVar176 = auVar125._12_4_ * fVar55;
    auVar238._0_4_ = auVar10._0_4_ * fVar58;
    auVar238._4_4_ = auVar10._4_4_ * fVar58;
    auVar238._8_4_ = auVar10._8_4_ * fVar58;
    auVar238._12_4_ = auVar10._12_4_ * fVar58;
    fVar58 = auVar128._0_4_;
    auVar199._0_4_ = auVar125._0_4_ * fVar58;
    auVar199._4_4_ = auVar125._4_4_ * fVar58;
    auVar199._8_4_ = auVar125._8_4_ * fVar58;
    auVar199._12_4_ = auVar125._12_4_ * fVar58;
    auVar125 = vsubps_avx(auVar238,auVar199);
    auVar128 = vrcpss_avx(auVar60,auVar60);
    auVar102 = vfnmadd213ss_fma(auVar102,auVar128,SUB6416(ZEXT464(0x40000000),0));
    fVar82 = auVar128._0_4_ * auVar102._0_4_;
    auVar102 = vdpps_avx(auVar11,auVar11,0x7f);
    fVar83 = auVar102._0_4_;
    auVar60 = ZEXT416((uint)fVar83);
    auVar128 = vrsqrtss_avx(auVar60,auVar60);
    fVar58 = auVar128._0_4_;
    fVar58 = fVar58 * 1.5 + fVar83 * -0.5 * fVar58 * fVar58 * fVar58;
    fVar243 = fVar58 * auVar11._0_4_;
    fVar255 = fVar58 * auVar11._4_4_;
    fVar256 = fVar58 * auVar11._8_4_;
    fVar257 = fVar58 * auVar11._12_4_;
    auVar128 = vdpps_avx(auVar11,auVar12,0x7f);
    auVar180._0_4_ = fVar83 * auVar12._0_4_;
    auVar180._4_4_ = fVar83 * auVar12._4_4_;
    auVar180._8_4_ = fVar83 * auVar12._8_4_;
    auVar180._12_4_ = fVar83 * auVar12._12_4_;
    fVar83 = auVar128._0_4_;
    auVar146._0_4_ = fVar83 * auVar11._0_4_;
    auVar146._4_4_ = fVar83 * auVar11._4_4_;
    auVar146._8_4_ = fVar83 * auVar11._8_4_;
    auVar146._12_4_ = fVar83 * auVar11._12_4_;
    auVar10 = vsubps_avx(auVar180,auVar146);
    auVar128 = vrcpss_avx(auVar60,auVar60);
    auVar102 = vfnmadd213ss_fma(auVar102,auVar128,SUB6416(ZEXT464(0x40000000),0));
    fVar83 = auVar102._0_4_ * auVar128._0_4_;
    auVar102 = vshufps_avx(auVar107,auVar107,0xff);
    auVar210._0_4_ = auVar102._0_4_ * fVar157;
    auVar210._4_4_ = auVar102._4_4_ * fVar174;
    auVar210._8_4_ = auVar102._8_4_ * fVar175;
    auVar210._12_4_ = auVar102._12_4_ * fVar176;
    local_428 = vsubps_avx(auVar107,auVar210);
    auVar128 = vshufps_avx(auVar88,auVar88,0xff);
    auVar160._0_4_ = auVar128._0_4_ * fVar157 + fVar55 * auVar125._0_4_ * fVar82 * auVar102._0_4_;
    auVar160._4_4_ = auVar128._4_4_ * fVar174 + fVar55 * auVar125._4_4_ * fVar82 * auVar102._4_4_;
    auVar160._8_4_ = auVar128._8_4_ * fVar175 + fVar55 * auVar125._8_4_ * fVar82 * auVar102._8_4_;
    auVar160._12_4_ =
         auVar128._12_4_ * fVar176 + fVar55 * auVar125._12_4_ * fVar82 * auVar102._12_4_;
    auVar125 = vsubps_avx(auVar88,auVar160);
    local_438._0_4_ = auVar210._0_4_ + auVar107._0_4_;
    local_438._4_4_ = auVar210._4_4_ + auVar107._4_4_;
    fStack_430 = auVar210._8_4_ + auVar107._8_4_;
    fStack_42c = auVar210._12_4_ + auVar107._12_4_;
    auVar102 = vshufps_avx(auVar87,auVar87,0xff);
    auVar109._0_4_ = fVar243 * auVar102._0_4_;
    auVar109._4_4_ = fVar255 * auVar102._4_4_;
    auVar109._8_4_ = fVar256 * auVar102._8_4_;
    auVar109._12_4_ = fVar257 * auVar102._12_4_;
    local_448 = vsubps_avx(auVar87,auVar109);
    auVar128 = vshufps_avx(auVar59,auVar59,0xff);
    auVar90._0_4_ = fVar243 * auVar128._0_4_ + auVar102._0_4_ * fVar58 * auVar10._0_4_ * fVar83;
    auVar90._4_4_ = fVar255 * auVar128._4_4_ + auVar102._4_4_ * fVar58 * auVar10._4_4_ * fVar83;
    auVar90._8_4_ = fVar256 * auVar128._8_4_ + auVar102._8_4_ * fVar58 * auVar10._8_4_ * fVar83;
    auVar90._12_4_ = fVar257 * auVar128._12_4_ + auVar102._12_4_ * fVar58 * auVar10._12_4_ * fVar83;
    auVar102 = vsubps_avx(auVar59,auVar90);
    fVar157 = auVar87._0_4_ + auVar109._0_4_;
    fVar174 = auVar87._4_4_ + auVar109._4_4_;
    fVar175 = auVar87._8_4_ + auVar109._8_4_;
    fVar176 = auVar87._12_4_ + auVar109._12_4_;
    local_458._0_4_ = local_428._0_4_ + auVar125._0_4_ * 0.33333334;
    local_458._4_4_ = local_428._4_4_ + auVar125._4_4_ * 0.33333334;
    local_458._8_4_ = local_428._8_4_ + auVar125._8_4_ * 0.33333334;
    local_458._12_4_ = local_428._12_4_ + auVar125._12_4_ * 0.33333334;
    auVar91._0_4_ = auVar102._0_4_ * 0.33333334;
    auVar91._4_4_ = auVar102._4_4_ * 0.33333334;
    auVar91._8_4_ = auVar102._8_4_ * 0.33333334;
    auVar91._12_4_ = auVar102._12_4_ * 0.33333334;
    local_468 = vsubps_avx(local_448,auVar91);
    local_408 = vsubps_avx(local_428,auVar61);
    auVar102 = vshufps_avx(local_408,local_408,0x55);
    auVar128 = vshufps_avx(local_408,local_408,0xaa);
    aVar2 = pre->ray_space[k].vy.field_0;
    fVar55 = pre->ray_space[k].vz.field_0.m128[0];
    fVar58 = pre->ray_space[k].vz.field_0.m128[1];
    fVar82 = pre->ray_space[k].vz.field_0.m128[2];
    fVar83 = pre->ray_space[k].vz.field_0.m128[3];
    auVar92._0_4_ = fVar55 * auVar128._0_4_;
    auVar92._4_4_ = fVar58 * auVar128._4_4_;
    auVar92._8_4_ = fVar82 * auVar128._8_4_;
    auVar92._12_4_ = fVar83 * auVar128._12_4_;
    auVar125 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar2,auVar102);
    local_418 = vsubps_avx(local_458,auVar61);
    auVar102 = vshufps_avx(local_418,local_418,0x55);
    auVar128 = vshufps_avx(local_418,local_418,0xaa);
    auVar278._0_4_ = fVar55 * auVar128._0_4_;
    auVar278._4_4_ = fVar58 * auVar128._4_4_;
    auVar278._8_4_ = fVar82 * auVar128._8_4_;
    auVar278._12_4_ = fVar83 * auVar128._12_4_;
    auVar128 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar2,auVar102);
    local_2c8 = vsubps_avx(local_468,auVar61);
    auVar102 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar245._0_4_ = fVar55 * auVar102._0_4_;
    auVar245._4_4_ = fVar58 * auVar102._4_4_;
    auVar245._8_4_ = fVar82 * auVar102._8_4_;
    auVar245._12_4_ = fVar83 * auVar102._12_4_;
    auVar102 = vshufps_avx(local_2c8,local_2c8,0x55);
    auVar10 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar2,auVar102);
    local_2d8 = vsubps_avx(local_448,auVar61);
    auVar102 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar259._0_4_ = fVar55 * auVar102._0_4_;
    auVar259._4_4_ = fVar58 * auVar102._4_4_;
    auVar259._8_4_ = fVar82 * auVar102._8_4_;
    auVar259._12_4_ = fVar83 * auVar102._12_4_;
    auVar102 = vshufps_avx(local_2d8,local_2d8,0x55);
    auVar11 = vfmadd231ps_fma(auVar259,(undefined1  [16])aVar2,auVar102);
    local_2e8 = vsubps_avx(_local_438,auVar61);
    auVar102 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar147._0_4_ = fVar55 * auVar102._0_4_;
    auVar147._4_4_ = fVar58 * auVar102._4_4_;
    auVar147._8_4_ = fVar82 * auVar102._8_4_;
    auVar147._12_4_ = fVar83 * auVar102._12_4_;
    auVar102 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar12 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar102);
    local_478._0_4_ = (fVar117 + auVar160._0_4_) * 0.33333334 + (float)local_438._0_4_;
    local_478._4_4_ = (fVar81 + auVar160._4_4_) * 0.33333334 + (float)local_438._4_4_;
    fStack_470 = (fVar57 + auVar160._8_4_) * 0.33333334 + fStack_430;
    fStack_46c = (fVar84 + auVar160._12_4_) * 0.33333334 + fStack_42c;
    local_2f8 = vsubps_avx(_local_478,auVar61);
    auVar102 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar200._0_4_ = auVar102._0_4_ * fVar55;
    auVar200._4_4_ = auVar102._4_4_ * fVar58;
    auVar200._8_4_ = auVar102._8_4_ * fVar82;
    auVar200._12_4_ = auVar102._12_4_ * fVar83;
    auVar102 = vshufps_avx(local_2f8,local_2f8,0x55);
    auVar60 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar2,auVar102);
    auVar211._0_4_ = (fVar177 + auVar90._0_4_) * 0.33333334;
    auVar211._4_4_ = (fVar223 + auVar90._4_4_) * 0.33333334;
    auVar211._8_4_ = (fVar131 + auVar90._8_4_) * 0.33333334;
    auVar211._12_4_ = (fVar142 + auVar90._12_4_) * 0.33333334;
    auVar42._4_4_ = fVar174;
    auVar42._0_4_ = fVar157;
    auVar42._8_4_ = fVar175;
    auVar42._12_4_ = fVar176;
    _local_488 = vsubps_avx(auVar42,auVar211);
    local_308 = vsubps_avx(_local_488,auVar61);
    auVar102 = vshufps_avx(local_308,local_308,0xaa);
    auVar212._0_4_ = auVar102._0_4_ * fVar55;
    auVar212._4_4_ = auVar102._4_4_ * fVar58;
    auVar212._8_4_ = auVar102._8_4_ * fVar82;
    auVar212._12_4_ = auVar102._12_4_ * fVar83;
    auVar102 = vshufps_avx(local_308,local_308,0x55);
    auVar107 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar102);
    local_318 = vsubps_avx(auVar42,auVar61);
    auVar102 = vshufps_avx(local_318,local_318,0xaa);
    auVar63._0_4_ = fVar55 * auVar102._0_4_;
    auVar63._4_4_ = fVar58 * auVar102._4_4_;
    auVar63._8_4_ = fVar82 * auVar102._8_4_;
    auVar63._12_4_ = fVar83 * auVar102._12_4_;
    auVar102 = vshufps_avx(local_318,local_318,0x55);
    auVar102 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar102);
    auVar161._4_4_ = local_408._0_4_;
    auVar161._0_4_ = local_408._0_4_;
    auVar161._8_4_ = local_408._0_4_;
    auVar161._12_4_ = local_408._0_4_;
    aVar2 = pre->ray_space[k].vx.field_0;
    auVar61 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar2,auVar161);
    auVar162._4_4_ = local_418._0_4_;
    auVar162._0_4_ = local_418._0_4_;
    auVar162._8_4_ = local_418._0_4_;
    auVar162._12_4_ = local_418._0_4_;
    auVar87 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar2,auVar162);
    uVar56 = local_2c8._0_4_;
    auVar163._4_4_ = uVar56;
    auVar163._0_4_ = uVar56;
    auVar163._8_4_ = uVar56;
    auVar163._12_4_ = uVar56;
    auVar59 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar163);
    uVar56 = local_2d8._0_4_;
    auVar164._4_4_ = uVar56;
    auVar164._0_4_ = uVar56;
    auVar164._8_4_ = uVar56;
    auVar164._12_4_ = uVar56;
    auVar88 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar164);
    uVar56 = local_2e8._0_4_;
    auVar165._4_4_ = uVar56;
    auVar165._0_4_ = uVar56;
    auVar165._8_4_ = uVar56;
    auVar165._12_4_ = uVar56;
    auVar118 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar165);
    uVar56 = local_2f8._0_4_;
    auVar166._4_4_ = uVar56;
    auVar166._0_4_ = uVar56;
    auVar166._8_4_ = uVar56;
    auVar166._12_4_ = uVar56;
    auVar60 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar2,auVar166);
    uVar56 = local_308._0_4_;
    auVar167._4_4_ = uVar56;
    auVar167._0_4_ = uVar56;
    auVar167._8_4_ = uVar56;
    auVar167._12_4_ = uVar56;
    auVar107 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar2,auVar167);
    uVar56 = local_318._0_4_;
    auVar168._4_4_ = uVar56;
    auVar168._0_4_ = uVar56;
    auVar168._8_4_ = uVar56;
    auVar168._12_4_ = uVar56;
    auVar133 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar2,auVar168);
    auVar10 = vmovlhps_avx(auVar61,auVar118);
    auVar11 = vmovlhps_avx(auVar87,auVar60);
    auVar12 = vmovlhps_avx(auVar59,auVar107);
    _local_278 = vmovlhps_avx(auVar88,auVar133);
    auVar102 = vminps_avx(auVar10,auVar11);
    auVar128 = vminps_avx(auVar12,_local_278);
    auVar125 = vminps_avx(auVar102,auVar128);
    auVar102 = vmaxps_avx(auVar10,auVar11);
    auVar128 = vmaxps_avx(auVar12,_local_278);
    auVar102 = vmaxps_avx(auVar102,auVar128);
    auVar128 = vshufpd_avx(auVar125,auVar125,3);
    auVar125 = vminps_avx(auVar125,auVar128);
    auVar128 = vshufpd_avx(auVar102,auVar102,3);
    auVar128 = vmaxps_avx(auVar102,auVar128);
    auVar102 = vandps_avx(local_3f8,auVar125);
    auVar128 = vandps_avx(local_3f8,auVar128);
    auVar102 = vmaxps_avx(auVar102,auVar128);
    auVar128 = vmovshdup_avx(auVar102);
    auVar102 = vmaxss_avx(auVar128,auVar102);
    local_78 = auVar102._0_4_ * 9.536743e-07;
    auVar181._8_8_ = auVar61._0_8_;
    auVar181._0_8_ = auVar61._0_8_;
    auVar226._8_8_ = auVar87._0_8_;
    auVar226._0_8_ = auVar87._0_8_;
    auVar246._0_8_ = auVar59._0_8_;
    auVar246._8_8_ = auVar246._0_8_;
    auVar260._0_8_ = auVar88._0_8_;
    auVar260._8_8_ = auVar260._0_8_;
    local_288 = ZEXT416((uint)local_78);
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_68 = local_78;
    fStack_64 = local_78;
    fStack_60 = local_78;
    fStack_5c = local_78;
    fStack_90 = -local_78;
    local_98 = -local_78;
    fStack_94 = -local_78;
    fStack_8c = fStack_90;
    fStack_88 = fStack_90;
    fStack_84 = fStack_90;
    fStack_80 = fStack_90;
    fStack_7c = fStack_90;
    local_388 = uVar46;
    uStack_384 = uVar46;
    uStack_380 = uVar46;
    uStack_37c = uVar46;
    local_398 = uVar4;
    uStack_394 = uVar4;
    uStack_390 = uVar4;
    uStack_38c = uVar4;
    uVar54 = 0;
    fVar55 = *(float *)(ray + k * 4 + 0x30);
    local_298 = vsubps_avx(auVar11,auVar10);
    local_2a8 = vsubps_avx(auVar12,auVar11);
    local_2b8 = vsubps_avx(_local_278,auVar12);
    local_338 = vsubps_avx(_local_438,local_428);
    local_348 = vsubps_avx(_local_478,local_458);
    local_358 = vsubps_avx(_local_488,local_468);
    auVar43._4_4_ = fVar174;
    auVar43._0_4_ = fVar157;
    auVar43._8_4_ = fVar175;
    auVar43._12_4_ = fVar176;
    _local_368 = vsubps_avx(auVar43,local_448);
    auVar64 = ZEXT816(0x3f80000000000000);
    local_328 = auVar64;
LAB_01625796:
    auVar102 = vshufps_avx(auVar64,auVar64,0x50);
    auVar279._8_4_ = 0x3f800000;
    auVar279._0_8_ = 0x3f8000003f800000;
    auVar279._12_4_ = 0x3f800000;
    auVar282._16_4_ = 0x3f800000;
    auVar282._0_16_ = auVar279;
    auVar282._20_4_ = 0x3f800000;
    auVar282._24_4_ = 0x3f800000;
    auVar282._28_4_ = 0x3f800000;
    auVar128 = vsubps_avx(auVar279,auVar102);
    fVar58 = auVar102._0_4_;
    fVar131 = auVar118._0_4_;
    auVar65._0_4_ = fVar131 * fVar58;
    fVar82 = auVar102._4_4_;
    fVar142 = auVar118._4_4_;
    auVar65._4_4_ = fVar142 * fVar82;
    fVar83 = auVar102._8_4_;
    auVar65._8_4_ = fVar131 * fVar83;
    fVar117 = auVar102._12_4_;
    auVar65._12_4_ = fVar142 * fVar117;
    fVar243 = auVar60._0_4_;
    auVar169._0_4_ = fVar243 * fVar58;
    fVar255 = auVar60._4_4_;
    auVar169._4_4_ = fVar255 * fVar82;
    auVar169._8_4_ = fVar243 * fVar83;
    auVar169._12_4_ = fVar255 * fVar117;
    fVar195 = auVar107._0_4_;
    auVar135._0_4_ = fVar195 * fVar58;
    fVar206 = auVar107._4_4_;
    auVar135._4_4_ = fVar206 * fVar82;
    auVar135._8_4_ = fVar195 * fVar83;
    auVar135._12_4_ = fVar206 * fVar117;
    fVar207 = auVar133._0_4_;
    auVar110._0_4_ = fVar207 * fVar58;
    fVar222 = auVar133._4_4_;
    auVar110._4_4_ = fVar222 * fVar82;
    auVar110._8_4_ = fVar207 * fVar83;
    auVar110._12_4_ = fVar222 * fVar117;
    auVar87 = vfmadd231ps_fma(auVar65,auVar128,auVar181);
    auVar59 = vfmadd231ps_fma(auVar169,auVar128,auVar226);
    auVar88 = vfmadd231ps_fma(auVar135,auVar128,auVar246);
    auVar239 = vfmadd231ps_fma(auVar110,auVar260,auVar128);
    auVar102 = vmovshdup_avx(local_328);
    fVar58 = local_328._0_4_;
    fStack_140 = (auVar102._0_4_ - fVar58) * 0.04761905;
    auVar220._4_4_ = fVar58;
    auVar220._0_4_ = fVar58;
    auVar220._8_4_ = fVar58;
    auVar220._12_4_ = fVar58;
    auVar220._16_4_ = fVar58;
    auVar220._20_4_ = fVar58;
    auVar220._24_4_ = fVar58;
    auVar220._28_4_ = fVar58;
    auVar103._0_8_ = auVar102._0_8_;
    auVar103._8_8_ = auVar103._0_8_;
    auVar103._16_8_ = auVar103._0_8_;
    auVar103._24_8_ = auVar103._0_8_;
    auVar78 = vsubps_avx(auVar103,auVar220);
    uVar56 = auVar87._0_4_;
    auVar275._4_4_ = uVar56;
    auVar275._0_4_ = uVar56;
    auVar275._8_4_ = uVar56;
    auVar275._12_4_ = uVar56;
    auVar275._16_4_ = uVar56;
    auVar275._20_4_ = uVar56;
    auVar275._24_4_ = uVar56;
    auVar275._28_4_ = uVar56;
    auVar102 = vmovshdup_avx(auVar87);
    uVar85 = auVar102._0_8_;
    auVar268._8_8_ = uVar85;
    auVar268._0_8_ = uVar85;
    auVar268._16_8_ = uVar85;
    auVar268._24_8_ = uVar85;
    fVar223 = auVar59._0_4_;
    auVar251._4_4_ = fVar223;
    auVar251._0_4_ = fVar223;
    auVar251._8_4_ = fVar223;
    auVar251._12_4_ = fVar223;
    auVar251._16_4_ = fVar223;
    auVar251._20_4_ = fVar223;
    auVar251._24_4_ = fVar223;
    auVar251._28_4_ = fVar223;
    auVar128 = vmovshdup_avx(auVar59);
    auVar104._0_8_ = auVar128._0_8_;
    auVar104._8_8_ = auVar104._0_8_;
    auVar104._16_8_ = auVar104._0_8_;
    auVar104._24_8_ = auVar104._0_8_;
    fVar177 = auVar88._0_4_;
    auVar187._4_4_ = fVar177;
    auVar187._0_4_ = fVar177;
    auVar187._8_4_ = fVar177;
    auVar187._12_4_ = fVar177;
    auVar187._16_4_ = fVar177;
    auVar187._20_4_ = fVar177;
    auVar187._24_4_ = fVar177;
    auVar187._28_4_ = fVar177;
    auVar125 = vmovshdup_avx(auVar88);
    auVar204._0_8_ = auVar125._0_8_;
    auVar204._8_8_ = auVar204._0_8_;
    auVar204._16_8_ = auVar204._0_8_;
    auVar204._24_8_ = auVar204._0_8_;
    fVar84 = auVar239._0_4_;
    auVar61 = vmovshdup_avx(auVar239);
    auVar86 = vfmadd132ps_fma(auVar78,auVar220,_DAT_01faff20);
    auVar78 = vsubps_avx(auVar282,ZEXT1632(auVar86));
    fVar58 = auVar86._0_4_;
    fVar82 = auVar86._4_4_;
    auVar13._4_4_ = fVar223 * fVar82;
    auVar13._0_4_ = fVar223 * fVar58;
    fVar83 = auVar86._8_4_;
    auVar13._8_4_ = fVar223 * fVar83;
    fVar117 = auVar86._12_4_;
    auVar13._12_4_ = fVar223 * fVar117;
    auVar13._16_4_ = fVar223 * 0.0;
    auVar13._20_4_ = fVar223 * 0.0;
    auVar13._24_4_ = fVar223 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar86 = vfmadd231ps_fma(auVar13,auVar78,auVar275);
    fVar81 = auVar128._0_4_;
    fVar57 = auVar128._4_4_;
    auVar14._4_4_ = fVar57 * fVar82;
    auVar14._0_4_ = fVar81 * fVar58;
    auVar14._8_4_ = fVar81 * fVar83;
    auVar14._12_4_ = fVar57 * fVar117;
    auVar14._16_4_ = fVar81 * 0.0;
    auVar14._20_4_ = fVar57 * 0.0;
    auVar14._24_4_ = fVar81 * 0.0;
    auVar14._28_4_ = uVar56;
    auVar132 = vfmadd231ps_fma(auVar14,auVar78,auVar268);
    auVar15._4_4_ = fVar177 * fVar82;
    auVar15._0_4_ = fVar177 * fVar58;
    auVar15._8_4_ = fVar177 * fVar83;
    auVar15._12_4_ = fVar177 * fVar117;
    auVar15._16_4_ = fVar177 * 0.0;
    auVar15._20_4_ = fVar177 * 0.0;
    auVar15._24_4_ = fVar177 * 0.0;
    auVar15._28_4_ = auVar102._4_4_;
    auVar122 = vfmadd231ps_fma(auVar15,auVar78,auVar251);
    fVar81 = auVar125._0_4_;
    fVar57 = auVar125._4_4_;
    auVar9._4_4_ = fVar57 * fVar82;
    auVar9._0_4_ = fVar81 * fVar58;
    auVar9._8_4_ = fVar81 * fVar83;
    auVar9._12_4_ = fVar57 * fVar117;
    auVar9._16_4_ = fVar81 * 0.0;
    auVar9._20_4_ = fVar57 * 0.0;
    auVar9._24_4_ = fVar81 * 0.0;
    auVar9._28_4_ = fVar223;
    auVar143 = vfmadd231ps_fma(auVar9,auVar78,auVar104);
    auVar102 = vshufps_avx(auVar87,auVar87,0xaa);
    local_538._8_8_ = auVar102._0_8_;
    local_538._0_8_ = local_538._8_8_;
    local_538._16_8_ = local_538._8_8_;
    local_538._24_8_ = local_538._8_8_;
    auVar128 = vshufps_avx(auVar87,auVar87,0xff);
    uStack_5e0 = auVar128._0_8_;
    local_5e8 = (undefined1  [8])uStack_5e0;
    uStack_5d8 = uStack_5e0;
    uStack_5d0 = uStack_5e0;
    auVar16._4_4_ = fVar84 * fVar82;
    auVar16._0_4_ = fVar84 * fVar58;
    auVar16._8_4_ = fVar84 * fVar83;
    auVar16._12_4_ = fVar84 * fVar117;
    auVar16._16_4_ = fVar84 * 0.0;
    auVar16._20_4_ = fVar84 * 0.0;
    auVar16._24_4_ = fVar84 * 0.0;
    auVar16._28_4_ = fVar84;
    auVar87 = vfmadd231ps_fma(auVar16,auVar78,auVar187);
    auVar128 = vshufps_avx(auVar59,auVar59,0xaa);
    auVar188._0_8_ = auVar128._0_8_;
    auVar188._8_8_ = auVar188._0_8_;
    auVar188._16_8_ = auVar188._0_8_;
    auVar188._24_8_ = auVar188._0_8_;
    auVar125 = vshufps_avx(auVar59,auVar59,0xff);
    local_4d8._8_8_ = auVar125._0_8_;
    local_4d8._0_8_ = local_4d8._8_8_;
    local_4d8._16_8_ = local_4d8._8_8_;
    local_4d8._24_8_ = local_4d8._8_8_;
    fVar81 = auVar61._0_4_;
    fVar57 = auVar61._4_4_;
    auVar253._4_4_ = fVar57 * fVar82;
    auVar253._0_4_ = fVar81 * fVar58;
    auVar253._8_4_ = fVar81 * fVar83;
    auVar253._12_4_ = fVar57 * fVar117;
    auVar253._16_4_ = fVar81 * 0.0;
    auVar253._20_4_ = fVar57 * 0.0;
    auVar253._24_4_ = fVar81 * 0.0;
    auVar253._28_4_ = auVar102._4_4_;
    auVar144 = vfmadd231ps_fma(auVar253,auVar78,auVar204);
    auVar18._28_4_ = fVar57;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar122._12_4_ * fVar117,
                            CONCAT48(auVar122._8_4_ * fVar83,
                                     CONCAT44(auVar122._4_4_ * fVar82,auVar122._0_4_ * fVar58))));
    auVar86 = vfmadd231ps_fma(auVar18,auVar78,ZEXT1632(auVar86));
    fVar81 = auVar125._4_4_;
    auVar19._28_4_ = fVar81;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar143._12_4_ * fVar117,
                            CONCAT48(auVar143._8_4_ * fVar83,
                                     CONCAT44(auVar143._4_4_ * fVar82,auVar143._0_4_ * fVar58))));
    auVar132 = vfmadd231ps_fma(auVar19,auVar78,ZEXT1632(auVar132));
    auVar102 = vshufps_avx(auVar88,auVar88,0xaa);
    uVar85 = auVar102._0_8_;
    auVar173._8_8_ = uVar85;
    auVar173._0_8_ = uVar85;
    auVar173._16_8_ = uVar85;
    auVar173._24_8_ = uVar85;
    auVar61 = vshufps_avx(auVar88,auVar88,0xff);
    uVar85 = auVar61._0_8_;
    auVar283._8_8_ = uVar85;
    auVar283._0_8_ = uVar85;
    auVar283._16_8_ = uVar85;
    auVar283._24_8_ = uVar85;
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar87._12_4_ * fVar117,
                                                 CONCAT48(auVar87._8_4_ * fVar83,
                                                          CONCAT44(auVar87._4_4_ * fVar82,
                                                                   auVar87._0_4_ * fVar58)))),
                              auVar78,ZEXT1632(auVar122));
    auVar87 = vshufps_avx(auVar239,auVar239,0xaa);
    auVar59 = vshufps_avx(auVar239,auVar239,0xff);
    auVar239 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar117 * auVar144._12_4_,
                                                  CONCAT48(fVar83 * auVar144._8_4_,
                                                           CONCAT44(fVar82 * auVar144._4_4_,
                                                                    fVar58 * auVar144._0_4_)))),
                               auVar78,ZEXT1632(auVar143));
    auVar122 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar117 * auVar88._12_4_,
                                                  CONCAT48(fVar83 * auVar88._8_4_,
                                                           CONCAT44(fVar82 * auVar88._4_4_,
                                                                    fVar58 * auVar88._0_4_)))),
                               auVar78,ZEXT1632(auVar86));
    auVar13 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar86));
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar117 * auVar239._12_4_,
                                                 CONCAT48(fVar83 * auVar239._8_4_,
                                                          CONCAT44(fVar82 * auVar239._4_4_,
                                                                   fVar58 * auVar239._0_4_)))),
                              auVar78,ZEXT1632(auVar132));
    auVar14 = vsubps_avx(ZEXT1632(auVar239),ZEXT1632(auVar132));
    fVar57 = auVar14._28_4_;
    auVar252._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
    auVar252._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
    auVar252._8_4_ = fStack_140 * auVar13._8_4_ * 3.0;
    auVar252._12_4_ = fStack_140 * auVar13._12_4_ * 3.0;
    auVar252._16_4_ = fStack_140 * auVar13._16_4_ * 3.0;
    auVar252._20_4_ = fStack_140 * auVar13._20_4_ * 3.0;
    auVar252._24_4_ = fStack_140 * auVar13._24_4_ * 3.0;
    auVar252._28_4_ = 0;
    local_3e8._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
    local_3e8._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
    fStack_3e0 = fStack_140 * auVar14._8_4_ * 3.0;
    fStack_3dc = fStack_140 * auVar14._12_4_ * 3.0;
    fStack_3d8 = fStack_140 * auVar14._16_4_ * 3.0;
    fStack_3d4 = fStack_140 * auVar14._20_4_ * 3.0;
    fStack_3d0 = fStack_140 * auVar14._24_4_ * 3.0;
    fStack_3cc = fVar57;
    fVar84 = auVar128._0_4_;
    fVar177 = auVar128._4_4_;
    auVar20._4_4_ = fVar177 * fVar82;
    auVar20._0_4_ = fVar84 * fVar58;
    auVar20._8_4_ = fVar84 * fVar83;
    auVar20._12_4_ = fVar177 * fVar117;
    auVar20._16_4_ = fVar84 * 0.0;
    auVar20._20_4_ = fVar177 * 0.0;
    auVar20._24_4_ = fVar84 * 0.0;
    auVar20._28_4_ = fVar57;
    auVar128 = vfmadd231ps_fma(auVar20,auVar78,local_538);
    fVar84 = auVar125._0_4_;
    auVar21._4_4_ = fVar81 * fVar82;
    auVar21._0_4_ = fVar84 * fVar58;
    auVar21._8_4_ = fVar84 * fVar83;
    auVar21._12_4_ = fVar81 * fVar117;
    auVar21._16_4_ = fVar84 * 0.0;
    auVar21._20_4_ = fVar81 * 0.0;
    auVar21._24_4_ = fVar84 * 0.0;
    auVar21._28_4_ = 0;
    auVar125 = vfmadd231ps_fma(auVar21,auVar78,_local_5e8);
    fVar81 = auVar102._0_4_;
    fVar84 = auVar102._4_4_;
    auVar22._4_4_ = fVar84 * fVar82;
    auVar22._0_4_ = fVar81 * fVar58;
    auVar22._8_4_ = fVar81 * fVar83;
    auVar22._12_4_ = fVar84 * fVar117;
    auVar22._16_4_ = fVar81 * 0.0;
    auVar22._20_4_ = fVar84 * 0.0;
    auVar22._24_4_ = fVar81 * 0.0;
    auVar22._28_4_ = auVar13._28_4_;
    auVar102 = vfmadd231ps_fma(auVar22,auVar78,auVar188);
    fVar81 = auVar61._0_4_;
    fVar223 = auVar61._4_4_;
    auVar23._4_4_ = fVar223 * fVar82;
    auVar23._0_4_ = fVar81 * fVar58;
    auVar23._8_4_ = fVar81 * fVar83;
    auVar23._12_4_ = fVar223 * fVar117;
    auVar23._16_4_ = fVar81 * 0.0;
    auVar23._20_4_ = fVar223 * 0.0;
    auVar23._24_4_ = fVar81 * 0.0;
    auVar23._28_4_ = fVar177;
    auVar61 = vfmadd231ps_fma(auVar23,auVar78,local_4d8);
    local_4d8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar122));
    fVar81 = auVar87._0_4_;
    fVar84 = auVar87._4_4_;
    auVar24._4_4_ = fVar84 * fVar82;
    auVar24._0_4_ = fVar81 * fVar58;
    auVar24._8_4_ = fVar81 * fVar83;
    auVar24._12_4_ = fVar84 * fVar117;
    auVar24._16_4_ = fVar81 * 0.0;
    auVar24._20_4_ = fVar84 * 0.0;
    auVar24._24_4_ = fVar81 * 0.0;
    auVar24._28_4_ = fVar84;
    auVar87 = vfmadd231ps_fma(auVar24,auVar78,auVar173);
    auVar16 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar88));
    fVar81 = auVar59._0_4_;
    fVar84 = auVar59._4_4_;
    auVar25._4_4_ = fVar84 * fVar82;
    auVar25._0_4_ = fVar81 * fVar58;
    auVar25._8_4_ = fVar81 * fVar83;
    auVar25._12_4_ = fVar84 * fVar117;
    auVar25._16_4_ = fVar81 * 0.0;
    auVar25._20_4_ = fVar84 * 0.0;
    auVar25._24_4_ = fVar81 * 0.0;
    auVar25._28_4_ = fVar84;
    auVar59 = vfmadd231ps_fma(auVar25,auVar78,auVar283);
    auVar26._28_4_ = fVar223;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar102._12_4_ * fVar117,
                            CONCAT48(auVar102._8_4_ * fVar83,
                                     CONCAT44(auVar102._4_4_ * fVar82,auVar102._0_4_ * fVar58))));
    auVar128 = vfmadd231ps_fma(auVar26,auVar78,ZEXT1632(auVar128));
    auVar125 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar117 * auVar61._12_4_,
                                                  CONCAT48(fVar83 * auVar61._8_4_,
                                                           CONCAT44(fVar82 * auVar61._4_4_,
                                                                    fVar58 * auVar61._0_4_)))),
                               auVar78,ZEXT1632(auVar125));
    auVar105._0_4_ = auVar122._0_4_ + auVar252._0_4_;
    auVar105._4_4_ = auVar122._4_4_ + auVar252._4_4_;
    auVar105._8_4_ = auVar122._8_4_ + auVar252._8_4_;
    auVar105._12_4_ = auVar122._12_4_ + auVar252._12_4_;
    auVar105._16_4_ = auVar252._16_4_ + 0.0;
    auVar105._20_4_ = auVar252._20_4_ + 0.0;
    auVar105._24_4_ = auVar252._24_4_ + 0.0;
    auVar105._28_4_ = 0;
    auVar102 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar87._12_4_ * fVar117,
                                                  CONCAT48(auVar87._8_4_ * fVar83,
                                                           CONCAT44(auVar87._4_4_ * fVar82,
                                                                    auVar87._0_4_ * fVar58)))),
                               auVar78,ZEXT1632(auVar102));
    auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar59._12_4_ * fVar117,
                                                 CONCAT48(auVar59._8_4_ * fVar83,
                                                          CONCAT44(auVar59._4_4_ * fVar82,
                                                                   auVar59._0_4_ * fVar58)))),
                              auVar78,ZEXT1632(auVar61));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar117 * auVar102._12_4_,
                                                 CONCAT48(fVar83 * auVar102._8_4_,
                                                          CONCAT44(fVar82 * auVar102._4_4_,
                                                                   fVar58 * auVar102._0_4_)))),
                              auVar78,ZEXT1632(auVar128));
    auVar59 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar61._12_4_ * fVar117,
                                                 CONCAT48(auVar61._8_4_ * fVar83,
                                                          CONCAT44(auVar61._4_4_ * fVar82,
                                                                   auVar61._0_4_ * fVar58)))),
                              ZEXT1632(auVar125),auVar78);
    auVar78 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar128));
    auVar13 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar125));
    auVar276._0_4_ = fStack_140 * auVar78._0_4_ * 3.0;
    auVar276._4_4_ = fStack_140 * auVar78._4_4_ * 3.0;
    auVar276._8_4_ = fStack_140 * auVar78._8_4_ * 3.0;
    auVar276._12_4_ = fStack_140 * auVar78._12_4_ * 3.0;
    auVar276._16_4_ = fStack_140 * auVar78._16_4_ * 3.0;
    auVar276._20_4_ = fStack_140 * auVar78._20_4_ * 3.0;
    auVar276._24_4_ = fStack_140 * auVar78._24_4_ * 3.0;
    auVar276._28_4_ = 0;
    local_158 = fStack_140 * auVar13._0_4_ * 3.0;
    fStack_154 = fStack_140 * auVar13._4_4_ * 3.0;
    auVar27._4_4_ = fStack_154;
    auVar27._0_4_ = local_158;
    fStack_150 = fStack_140 * auVar13._8_4_ * 3.0;
    auVar27._8_4_ = fStack_150;
    fStack_14c = fStack_140 * auVar13._12_4_ * 3.0;
    auVar27._12_4_ = fStack_14c;
    fStack_148 = fStack_140 * auVar13._16_4_ * 3.0;
    auVar27._16_4_ = fStack_148;
    fStack_144 = fStack_140 * auVar13._20_4_ * 3.0;
    auVar27._20_4_ = fStack_144;
    fStack_140 = fStack_140 * auVar13._24_4_ * 3.0;
    auVar27._24_4_ = fStack_140;
    auVar27._28_4_ = 0x40400000;
    _local_4f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar87));
    _local_3b8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar59));
    auVar78 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar122));
    auVar13 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar88));
    auVar14 = vsubps_avx(_local_4f8,local_4d8);
    fVar256 = auVar78._0_4_ + auVar14._0_4_;
    fVar257 = auVar78._4_4_ + auVar14._4_4_;
    fVar190 = auVar78._8_4_ + auVar14._8_4_;
    fVar191 = auVar78._12_4_ + auVar14._12_4_;
    fVar192 = auVar78._16_4_ + auVar14._16_4_;
    fVar193 = auVar78._20_4_ + auVar14._20_4_;
    fVar194 = auVar78._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_3b8,auVar16);
    auVar79._0_4_ = auVar13._0_4_ + auVar15._0_4_;
    auVar79._4_4_ = auVar13._4_4_ + auVar15._4_4_;
    auVar79._8_4_ = auVar13._8_4_ + auVar15._8_4_;
    auVar79._12_4_ = auVar13._12_4_ + auVar15._12_4_;
    auVar79._16_4_ = auVar13._16_4_ + auVar15._16_4_;
    auVar79._20_4_ = auVar13._20_4_ + auVar15._20_4_;
    auVar79._24_4_ = auVar13._24_4_ + auVar15._24_4_;
    auVar79._28_4_ = auVar13._28_4_ + auVar15._28_4_;
    local_f8 = ZEXT1632(auVar88);
    fVar58 = auVar88._0_4_;
    local_178 = (float)local_3e8._0_4_ + fVar58;
    fVar82 = auVar88._4_4_;
    fStack_174 = (float)local_3e8._4_4_ + fVar82;
    fVar83 = auVar88._8_4_;
    fStack_170 = fStack_3e0 + fVar83;
    fVar117 = auVar88._12_4_;
    fStack_16c = fStack_3dc + fVar117;
    fStack_168 = fStack_3d8 + 0.0;
    fStack_164 = fStack_3d4 + 0.0;
    fStack_160 = fStack_3d0 + 0.0;
    local_b8 = ZEXT1632(auVar122);
    auVar13 = vsubps_avx(local_b8,auVar252);
    local_d8 = vpermps_avx2(_DAT_01fec480,auVar13);
    auVar13 = vsubps_avx(local_f8,_local_3e8);
    local_198 = vpermps_avx2(_DAT_01fec480,auVar13);
    local_118._0_4_ = auVar87._0_4_ + auVar276._0_4_;
    local_118._4_4_ = auVar87._4_4_ + auVar276._4_4_;
    local_118._8_4_ = auVar87._8_4_ + auVar276._8_4_;
    local_118._12_4_ = auVar87._12_4_ + auVar276._12_4_;
    local_118._16_4_ = auVar276._16_4_ + 0.0;
    local_118._20_4_ = auVar276._20_4_ + 0.0;
    local_118._24_4_ = auVar276._24_4_ + 0.0;
    local_118._28_4_ = 0;
    auVar221 = ZEXT3264(local_118);
    auVar253 = ZEXT1632(auVar87);
    auVar13 = vsubps_avx(auVar253,auVar276);
    _local_3e8 = vpermps_avx2(_DAT_01fec480,auVar13);
    fVar81 = auVar59._0_4_;
    local_158 = fVar81 + local_158;
    fVar84 = auVar59._4_4_;
    fStack_154 = fVar84 + fStack_154;
    fVar177 = auVar59._8_4_;
    fStack_150 = fVar177 + fStack_150;
    fVar223 = auVar59._12_4_;
    fStack_14c = fVar223 + fStack_14c;
    fStack_148 = fStack_148 + 0.0;
    fStack_144 = fStack_144 + 0.0;
    fStack_140 = fStack_140 + 0.0;
    auVar13 = vsubps_avx(ZEXT1632(auVar59),auVar27);
    local_138 = vpermps_avx2(_DAT_01fec480,auVar13);
    auVar28._4_4_ = fVar82 * fVar257;
    auVar28._0_4_ = fVar58 * fVar256;
    auVar28._8_4_ = fVar83 * fVar190;
    auVar28._12_4_ = fVar117 * fVar191;
    auVar28._16_4_ = fVar192 * 0.0;
    auVar28._20_4_ = fVar193 * 0.0;
    auVar28._24_4_ = fVar194 * 0.0;
    auVar28._28_4_ = auVar13._28_4_;
    auVar102 = vfnmadd231ps_fma(auVar28,local_b8,auVar79);
    fStack_15c = fVar57 + 0.0;
    auVar29._4_4_ = fStack_174 * fVar257;
    auVar29._0_4_ = local_178 * fVar256;
    auVar29._8_4_ = fStack_170 * fVar190;
    auVar29._12_4_ = fStack_16c * fVar191;
    auVar29._16_4_ = fStack_168 * fVar192;
    auVar29._20_4_ = fStack_164 * fVar193;
    auVar29._24_4_ = fStack_160 * fVar194;
    auVar29._28_4_ = 0;
    auVar128 = vfnmadd231ps_fma(auVar29,auVar79,auVar105);
    auVar30._4_4_ = local_198._4_4_ * fVar257;
    auVar30._0_4_ = local_198._0_4_ * fVar256;
    auVar30._8_4_ = local_198._8_4_ * fVar190;
    auVar30._12_4_ = local_198._12_4_ * fVar191;
    auVar30._16_4_ = local_198._16_4_ * fVar192;
    auVar30._20_4_ = local_198._20_4_ * fVar193;
    auVar30._24_4_ = local_198._24_4_ * fVar194;
    auVar30._28_4_ = fVar57 + 0.0;
    auVar125 = vfnmadd231ps_fma(auVar30,local_d8,auVar79);
    local_5e8._0_4_ = auVar16._0_4_;
    local_5e8._4_4_ = auVar16._4_4_;
    uStack_5e0._0_4_ = auVar16._8_4_;
    uStack_5e0._4_4_ = auVar16._12_4_;
    uStack_5d8._0_4_ = auVar16._16_4_;
    uStack_5d8._4_4_ = auVar16._20_4_;
    uStack_5d0._0_4_ = auVar16._24_4_;
    uStack_5d0._4_4_ = auVar16._28_4_;
    auVar31._4_4_ = (float)local_5e8._4_4_ * fVar257;
    auVar31._0_4_ = (float)local_5e8._0_4_ * fVar256;
    auVar31._8_4_ = (float)uStack_5e0 * fVar190;
    auVar31._12_4_ = uStack_5e0._4_4_ * fVar191;
    auVar31._16_4_ = (float)uStack_5d8 * fVar192;
    auVar31._20_4_ = uStack_5d8._4_4_ * fVar193;
    auVar31._24_4_ = (float)uStack_5d0 * fVar194;
    auVar31._28_4_ = uStack_5d0._4_4_;
    auVar61 = vfnmadd231ps_fma(auVar31,local_4d8,auVar79);
    auVar205._0_4_ = fVar81 * fVar256;
    auVar205._4_4_ = fVar84 * fVar257;
    auVar205._8_4_ = fVar177 * fVar190;
    auVar205._12_4_ = fVar223 * fVar191;
    auVar205._16_4_ = fVar192 * 0.0;
    auVar205._20_4_ = fVar193 * 0.0;
    auVar205._24_4_ = fVar194 * 0.0;
    auVar205._28_4_ = 0;
    auVar87 = vfnmadd231ps_fma(auVar205,auVar253,auVar79);
    uStack_13c = 0x40400000;
    auVar32._4_4_ = fStack_154 * fVar257;
    auVar32._0_4_ = local_158 * fVar256;
    auVar32._8_4_ = fStack_150 * fVar190;
    auVar32._12_4_ = fStack_14c * fVar191;
    auVar32._16_4_ = fStack_148 * fVar192;
    auVar32._20_4_ = fStack_144 * fVar193;
    auVar32._24_4_ = fStack_140 * fVar194;
    auVar32._28_4_ = local_4d8._28_4_;
    auVar88 = vfnmadd231ps_fma(auVar32,local_118,auVar79);
    auVar33._4_4_ = local_138._4_4_ * fVar257;
    auVar33._0_4_ = local_138._0_4_ * fVar256;
    auVar33._8_4_ = local_138._8_4_ * fVar190;
    auVar33._12_4_ = local_138._12_4_ * fVar191;
    auVar33._16_4_ = local_138._16_4_ * fVar192;
    auVar33._20_4_ = local_138._20_4_ * fVar193;
    auVar33._24_4_ = local_138._24_4_ * fVar194;
    auVar33._28_4_ = local_138._28_4_;
    auVar239 = vfnmadd231ps_fma(auVar33,_local_3e8,auVar79);
    auVar34._4_4_ = local_3b8._4_4_ * fVar257;
    auVar34._0_4_ = local_3b8._0_4_ * fVar256;
    auVar34._8_4_ = local_3b8._8_4_ * fVar190;
    auVar34._12_4_ = local_3b8._12_4_ * fVar191;
    auVar34._16_4_ = local_3b8._16_4_ * fVar192;
    auVar34._20_4_ = local_3b8._20_4_ * fVar193;
    auVar34._24_4_ = local_3b8._24_4_ * fVar194;
    auVar34._28_4_ = auVar78._28_4_ + auVar14._28_4_;
    auVar86 = vfnmadd231ps_fma(auVar34,_local_4f8,auVar79);
    auVar13 = vminps_avx(ZEXT1632(auVar102),ZEXT1632(auVar128));
    auVar78 = vmaxps_avx(ZEXT1632(auVar102),ZEXT1632(auVar128));
    auVar14 = vminps_avx(ZEXT1632(auVar125),ZEXT1632(auVar61));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar125),ZEXT1632(auVar61));
    auVar78 = vmaxps_avx(auVar78,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
    auVar13 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
    auVar9 = vminps_avx(ZEXT1632(auVar239),ZEXT1632(auVar86));
    auVar15 = vminps_avx(auVar15,auVar9);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar239),ZEXT1632(auVar86));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar78,auVar13);
    auVar45._4_4_ = fStack_74;
    auVar45._0_4_ = local_78;
    auVar45._8_4_ = fStack_70;
    auVar45._12_4_ = fStack_6c;
    auVar45._16_4_ = fStack_68;
    auVar45._20_4_ = fStack_64;
    auVar45._24_4_ = fStack_60;
    auVar45._28_4_ = fStack_5c;
    auVar78 = vcmpps_avx(auVar15,auVar45,2);
    auVar44._4_4_ = fStack_94;
    auVar44._0_4_ = local_98;
    auVar44._8_4_ = fStack_90;
    auVar44._12_4_ = fStack_8c;
    auVar44._16_4_ = fStack_88;
    auVar44._20_4_ = fStack_84;
    auVar44._24_4_ = fStack_80;
    auVar44._28_4_ = fStack_7c;
    auVar13 = vcmpps_avx(auVar13,auVar44,5);
    auVar78 = vandps_avx(auVar13,auVar78);
    auVar13 = local_1b8 & auVar78;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_4d8,local_b8);
      auVar14 = vsubps_avx(_local_4f8,auVar253);
      fVar256 = auVar13._0_4_ + auVar14._0_4_;
      fVar257 = auVar13._4_4_ + auVar14._4_4_;
      fVar190 = auVar13._8_4_ + auVar14._8_4_;
      fVar191 = auVar13._12_4_ + auVar14._12_4_;
      fVar192 = auVar13._16_4_ + auVar14._16_4_;
      fVar193 = auVar13._20_4_ + auVar14._20_4_;
      fVar194 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(auVar16,local_f8);
      auVar9 = vsubps_avx(_local_3b8,ZEXT1632(auVar59));
      auVar106._0_4_ = auVar15._0_4_ + auVar9._0_4_;
      auVar106._4_4_ = auVar15._4_4_ + auVar9._4_4_;
      auVar106._8_4_ = auVar15._8_4_ + auVar9._8_4_;
      auVar106._12_4_ = auVar15._12_4_ + auVar9._12_4_;
      auVar106._16_4_ = auVar15._16_4_ + auVar9._16_4_;
      auVar106._20_4_ = auVar15._20_4_ + auVar9._20_4_;
      auVar106._24_4_ = auVar15._24_4_ + auVar9._24_4_;
      fVar57 = auVar9._28_4_;
      auVar106._28_4_ = auVar15._28_4_ + fVar57;
      auVar35._4_4_ = fVar82 * fVar257;
      auVar35._0_4_ = fVar58 * fVar256;
      auVar35._8_4_ = fVar83 * fVar190;
      auVar35._12_4_ = fVar117 * fVar191;
      auVar35._16_4_ = fVar192 * 0.0;
      auVar35._20_4_ = fVar193 * 0.0;
      auVar35._24_4_ = fVar194 * 0.0;
      auVar35._28_4_ = local_4f8._28_4_;
      auVar87 = vfnmadd231ps_fma(auVar35,auVar106,local_b8);
      auVar36._4_4_ = fVar257 * fStack_174;
      auVar36._0_4_ = fVar256 * local_178;
      auVar36._8_4_ = fVar190 * fStack_170;
      auVar36._12_4_ = fVar191 * fStack_16c;
      auVar36._16_4_ = fVar192 * fStack_168;
      auVar36._20_4_ = fVar193 * fStack_164;
      auVar36._24_4_ = fVar194 * fStack_160;
      auVar36._28_4_ = 0;
      auVar102 = vfnmadd213ps_fma(auVar105,auVar106,auVar36);
      auVar37._4_4_ = fVar257 * local_198._4_4_;
      auVar37._0_4_ = fVar256 * local_198._0_4_;
      auVar37._8_4_ = fVar190 * local_198._8_4_;
      auVar37._12_4_ = fVar191 * local_198._12_4_;
      auVar37._16_4_ = fVar192 * local_198._16_4_;
      auVar37._20_4_ = fVar193 * local_198._20_4_;
      auVar37._24_4_ = fVar194 * local_198._24_4_;
      auVar37._28_4_ = 0;
      auVar128 = vfnmadd213ps_fma(local_d8,auVar106,auVar37);
      auVar38._4_4_ = (float)local_5e8._4_4_ * fVar257;
      auVar38._0_4_ = (float)local_5e8._0_4_ * fVar256;
      auVar38._8_4_ = (float)uStack_5e0 * fVar190;
      auVar38._12_4_ = uStack_5e0._4_4_ * fVar191;
      auVar38._16_4_ = (float)uStack_5d8 * fVar192;
      auVar38._20_4_ = uStack_5d8._4_4_ * fVar193;
      auVar38._24_4_ = (float)uStack_5d0 * fVar194;
      auVar38._28_4_ = 0;
      auVar59 = vfnmadd231ps_fma(auVar38,auVar106,local_4d8);
      auVar129._0_4_ = fVar81 * fVar256;
      auVar129._4_4_ = fVar84 * fVar257;
      auVar129._8_4_ = fVar177 * fVar190;
      auVar129._12_4_ = fVar223 * fVar191;
      auVar129._16_4_ = fVar192 * 0.0;
      auVar129._20_4_ = fVar193 * 0.0;
      auVar129._24_4_ = fVar194 * 0.0;
      auVar129._28_4_ = 0;
      auVar88 = vfnmadd231ps_fma(auVar129,auVar106,auVar253);
      auVar39._4_4_ = fVar257 * fStack_154;
      auVar39._0_4_ = fVar256 * local_158;
      auVar39._8_4_ = fVar190 * fStack_150;
      auVar39._12_4_ = fVar191 * fStack_14c;
      auVar39._16_4_ = fVar192 * fStack_148;
      auVar39._20_4_ = fVar193 * fStack_144;
      auVar39._24_4_ = fVar194 * fStack_140;
      auVar39._28_4_ = fVar57;
      auVar125 = vfnmadd213ps_fma(local_118,auVar106,auVar39);
      auVar40._4_4_ = fVar257 * local_138._4_4_;
      auVar40._0_4_ = fVar256 * local_138._0_4_;
      auVar40._8_4_ = fVar190 * local_138._8_4_;
      auVar40._12_4_ = fVar191 * local_138._12_4_;
      auVar40._16_4_ = fVar192 * local_138._16_4_;
      auVar40._20_4_ = fVar193 * local_138._20_4_;
      auVar40._24_4_ = fVar194 * local_138._24_4_;
      auVar40._28_4_ = fVar57;
      auVar61 = vfnmadd213ps_fma(_local_3e8,auVar106,auVar40);
      auVar221 = ZEXT1664(auVar61);
      auVar41._4_4_ = fVar257 * local_3b8._4_4_;
      auVar41._0_4_ = fVar256 * local_3b8._0_4_;
      auVar41._8_4_ = fVar190 * local_3b8._8_4_;
      auVar41._12_4_ = fVar191 * local_3b8._12_4_;
      auVar41._16_4_ = fVar192 * local_3b8._16_4_;
      auVar41._20_4_ = fVar193 * local_3b8._20_4_;
      auVar41._24_4_ = fVar194 * local_3b8._24_4_;
      auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar239 = vfnmadd231ps_fma(auVar41,auVar106,_local_4f8);
      auVar14 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar102));
      auVar13 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar102));
      auVar15 = vminps_avx(ZEXT1632(auVar128),ZEXT1632(auVar59));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar128),ZEXT1632(auVar59));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar9 = vminps_avx(ZEXT1632(auVar88),ZEXT1632(auVar125));
      auVar14 = vmaxps_avx(ZEXT1632(auVar88),ZEXT1632(auVar125));
      auVar16 = vminps_avx(ZEXT1632(auVar61),ZEXT1632(auVar239));
      auVar9 = vminps_avx(auVar9,auVar16);
      auVar9 = vminps_avx(auVar15,auVar9);
      auVar15 = vmaxps_avx(ZEXT1632(auVar61),ZEXT1632(auVar239));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar9,auVar45,2);
      auVar14 = vcmpps_avx(auVar14,auVar44,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar78 = vandps_avx(auVar78,local_1b8);
      auVar14 = auVar78 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar78 = vandps_avx(auVar13,auVar78);
        uVar51 = vmovmskps_avx(auVar78);
        if (uVar51 != 0) {
          uVar53 = (ulong)uVar54;
          auStack_3c8[uVar53] = uVar51 & 0xff;
          uVar85 = vmovlps_avx(local_328);
          *(undefined8 *)(&uStack_268 + uVar53 * 2) = uVar85;
          uVar47 = vmovlps_avx(auVar64);
          auStack_58[uVar53] = uVar47;
          uVar54 = uVar54 + 1;
        }
      }
    }
    auVar254 = ZEXT464(0x3f800000);
    if (uVar54 != 0) {
      do {
        uVar53 = (ulong)(uVar54 - 1);
        uVar50 = auStack_3c8[uVar53];
        uVar51 = (&uStack_268)[uVar53 * 2];
        fVar58 = afStack_264[uVar53 * 2];
        iVar17 = 0;
        for (uVar47 = (ulong)uVar50; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
          iVar17 = iVar17 + 1;
        }
        uVar50 = uVar50 - 1 & uVar50;
        if (uVar50 == 0) {
          uVar54 = uVar54 - 1;
        }
        auVar64._8_8_ = 0;
        auVar64._0_8_ = auStack_58[uVar53];
        auStack_3c8[uVar53] = uVar50;
        fVar82 = (float)(iVar17 + 1) * 0.14285715;
        auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * (float)iVar17 * 0.14285715)),
                                   ZEXT416(uVar51),
                                   ZEXT416((uint)(auVar254._0_4_ - (float)iVar17 * 0.14285715)));
        auVar128 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar82)),ZEXT416(uVar51),
                                   ZEXT416((uint)(auVar254._0_4_ - fVar82)));
        fVar82 = auVar128._0_4_;
        fVar83 = auVar102._0_4_;
        fVar58 = fVar82 - fVar83;
        if (0.16666667 <= fVar58) {
          local_328 = vinsertps_avx(auVar102,auVar128,0x10);
          goto LAB_01625796;
        }
        auVar125 = vshufps_avx(auVar64,auVar64,0x50);
        auVar93._8_4_ = 0x3f800000;
        auVar93._0_8_ = 0x3f8000003f800000;
        auVar93._12_4_ = 0x3f800000;
        auVar61 = vsubps_avx(auVar93,auVar125);
        fVar117 = auVar125._0_4_;
        auVar136._0_4_ = fVar117 * fVar131;
        fVar81 = auVar125._4_4_;
        auVar136._4_4_ = fVar81 * fVar142;
        fVar57 = auVar125._8_4_;
        auVar136._8_4_ = fVar57 * fVar131;
        fVar84 = auVar125._12_4_;
        auVar136._12_4_ = fVar84 * fVar142;
        auVar148._0_4_ = fVar117 * fVar243;
        auVar148._4_4_ = fVar81 * fVar255;
        auVar148._8_4_ = fVar57 * fVar243;
        auVar148._12_4_ = fVar84 * fVar255;
        auVar170._0_4_ = fVar117 * fVar195;
        auVar170._4_4_ = fVar81 * fVar206;
        auVar170._8_4_ = fVar57 * fVar195;
        auVar170._12_4_ = fVar84 * fVar206;
        auVar66._0_4_ = fVar117 * fVar207;
        auVar66._4_4_ = fVar81 * fVar222;
        auVar66._8_4_ = fVar57 * fVar207;
        auVar66._12_4_ = fVar84 * fVar222;
        auVar125 = vfmadd231ps_fma(auVar136,auVar61,auVar181);
        auVar87 = vfmadd231ps_fma(auVar148,auVar61,auVar226);
        auVar59 = vfmadd231ps_fma(auVar170,auVar61,auVar246);
        auVar61 = vfmadd231ps_fma(auVar66,auVar61,auVar260);
        auVar130._16_16_ = auVar125;
        auVar130._0_16_ = auVar125;
        auVar141._16_16_ = auVar87;
        auVar141._0_16_ = auVar87;
        auVar156._16_16_ = auVar59;
        auVar156._0_16_ = auVar59;
        auVar189._4_4_ = fVar83;
        auVar189._0_4_ = fVar83;
        auVar189._8_4_ = fVar83;
        auVar189._12_4_ = fVar83;
        auVar189._20_4_ = fVar82;
        auVar189._16_4_ = fVar82;
        auVar189._24_4_ = fVar82;
        auVar189._28_4_ = fVar82;
        auVar78 = vsubps_avx(auVar141,auVar130);
        auVar87 = vfmadd213ps_fma(auVar78,auVar189,auVar130);
        auVar78 = vsubps_avx(auVar156,auVar141);
        auVar88 = vfmadd213ps_fma(auVar78,auVar189,auVar141);
        auVar125 = vsubps_avx(auVar61,auVar59);
        auVar80._16_16_ = auVar125;
        auVar80._0_16_ = auVar125;
        auVar125 = vfmadd213ps_fma(auVar80,auVar189,auVar156);
        auVar78 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar87));
        auVar61 = vfmadd213ps_fma(auVar78,auVar189,ZEXT1632(auVar87));
        auVar78 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar88));
        auVar125 = vfmadd213ps_fma(auVar78,auVar189,ZEXT1632(auVar88));
        auVar78 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar61));
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar78,auVar189);
        fVar223 = auVar78._4_4_ * 3.0;
        local_4d8._0_4_ = fVar58;
        fVar117 = fVar58 * 0.33333334;
        auVar182._0_8_ =
             CONCAT44(auVar86._4_4_ + fVar117 * fVar223,
                      auVar86._0_4_ + fVar117 * auVar78._0_4_ * 3.0);
        auVar182._8_4_ = auVar86._8_4_ + fVar117 * auVar78._8_4_ * 3.0;
        auVar182._12_4_ = auVar86._12_4_ + fVar117 * auVar78._12_4_ * 3.0;
        _local_3b8 = vshufpd_avx(auVar86,auVar86,3);
        auVar61 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar125 = vsubps_avx(_local_3b8,auVar86);
        _local_4f8 = auVar61;
        auVar87 = vsubps_avx(auVar61,(undefined1  [16])0x0);
        auVar67._0_4_ = auVar125._0_4_ + auVar87._0_4_;
        auVar67._4_4_ = auVar125._4_4_ + auVar87._4_4_;
        auVar67._8_4_ = auVar125._8_4_ + auVar87._8_4_;
        auVar67._12_4_ = auVar125._12_4_ + auVar87._12_4_;
        auVar125 = vshufps_avx(auVar86,auVar86,0xb1);
        auVar87 = vshufps_avx(auVar182,auVar182,0xb1);
        auVar272._4_4_ = auVar67._0_4_;
        auVar272._0_4_ = auVar67._0_4_;
        auVar272._8_4_ = auVar67._0_4_;
        auVar272._12_4_ = auVar67._0_4_;
        auVar59 = vshufps_avx(auVar67,auVar67,0x55);
        fVar81 = auVar59._0_4_;
        auVar68._0_4_ = fVar81 * auVar125._0_4_;
        fVar57 = auVar59._4_4_;
        auVar68._4_4_ = fVar57 * auVar125._4_4_;
        fVar84 = auVar59._8_4_;
        auVar68._8_4_ = fVar84 * auVar125._8_4_;
        fVar177 = auVar59._12_4_;
        auVar68._12_4_ = fVar177 * auVar125._12_4_;
        auVar149._0_4_ = fVar81 * auVar87._0_4_;
        auVar149._4_4_ = fVar57 * auVar87._4_4_;
        auVar149._8_4_ = fVar84 * auVar87._8_4_;
        auVar149._12_4_ = fVar177 * auVar87._12_4_;
        auVar88 = vfmadd231ps_fma(auVar68,auVar272,auVar86);
        _local_3e8 = auVar182;
        auVar239 = vfmadd231ps_fma(auVar149,auVar272,auVar182);
        auVar87 = vshufps_avx(auVar88,auVar88,0xe8);
        auVar59 = vshufps_avx(auVar239,auVar239,0xe8);
        auVar125 = vcmpps_avx(auVar87,auVar59,1);
        uVar51 = vextractps_avx(auVar125,0);
        auVar132 = auVar239;
        if ((uVar51 & 1) == 0) {
          auVar132 = auVar88;
        }
        auVar121._0_4_ = fVar117 * auVar78._16_4_ * 3.0;
        auVar121._4_4_ = fVar117 * fVar223;
        auVar121._8_4_ = fVar117 * auVar78._24_4_ * 3.0;
        auVar121._12_4_ = fVar117 * auVar221._28_4_;
        auVar178 = vsubps_avx((undefined1  [16])0x0,auVar121);
        auVar122 = vshufps_avx(auVar178,auVar178,0xb1);
        auVar143 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar183._0_4_ = fVar81 * auVar122._0_4_;
        auVar183._4_4_ = fVar57 * auVar122._4_4_;
        auVar183._8_4_ = fVar84 * auVar122._8_4_;
        auVar183._12_4_ = fVar177 * auVar122._12_4_;
        auVar201._0_4_ = auVar143._0_4_ * fVar81;
        auVar201._4_4_ = auVar143._4_4_ * fVar57;
        auVar201._8_4_ = auVar143._8_4_ * fVar84;
        auVar201._12_4_ = auVar143._12_4_ * fVar177;
        auVar196 = vfmadd231ps_fma(auVar183,auVar272,auVar178);
        auVar197 = vfmadd231ps_fma(auVar201,(undefined1  [16])0x0,auVar272);
        auVar143 = vshufps_avx(auVar196,auVar196,0xe8);
        auVar144 = vshufps_avx(auVar197,auVar197,0xe8);
        auVar221 = ZEXT1664(auVar144);
        auVar122 = vcmpps_avx(auVar143,auVar144,1);
        uVar51 = vextractps_avx(auVar122,0);
        auVar208 = auVar197;
        if ((uVar51 & 1) == 0) {
          auVar208 = auVar196;
        }
        auVar132 = vmaxss_avx(auVar208,auVar132);
        auVar87 = vminps_avx(auVar87,auVar59);
        auVar59 = vminps_avx(auVar143,auVar144);
        auVar59 = vminps_avx(auVar87,auVar59);
        auVar125 = vshufps_avx(auVar125,auVar125,0x55);
        auVar125 = vblendps_avx(auVar125,auVar122,2);
        auVar122 = vpslld_avx(auVar125,0x1f);
        auVar125 = vshufpd_avx(auVar239,auVar239,1);
        auVar125 = vinsertps_avx(auVar125,auVar197,0x9c);
        auVar87 = vshufpd_avx(auVar88,auVar88,1);
        auVar87 = vinsertps_avx(auVar87,auVar196,0x9c);
        auVar125 = vblendvps_avx(auVar87,auVar125,auVar122);
        auVar87 = vmovshdup_avx(auVar125);
        auVar125 = vmaxss_avx(auVar87,auVar125);
        fVar84 = auVar59._0_4_;
        auVar87 = vmovshdup_avx(auVar59);
        auVar254 = ZEXT464(0x3f800000);
        fVar57 = auVar125._0_4_;
        fVar117 = auVar87._0_4_;
        fVar81 = auVar132._0_4_;
        if (((fVar84 < 0.0001) && (-0.0001 < fVar57)) || (fVar117 < 0.0001 && -0.0001 < fVar57)) {
LAB_01626042:
          auVar88 = vcmpps_avx(auVar59,_DAT_01f7aa10,1);
          auVar239 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar87 = vcmpss_avx(auVar132,ZEXT816(0) << 0x20,1);
          auVar94._8_4_ = 0x3f800000;
          auVar94._0_8_ = 0x3f8000003f800000;
          auVar94._12_4_ = 0x3f800000;
          auVar111._8_4_ = 0xbf800000;
          auVar111._0_8_ = 0xbf800000bf800000;
          auVar111._12_4_ = 0xbf800000;
          auVar87 = vblendvps_avx(auVar94,auVar111,auVar87);
          auVar88 = vblendvps_avx(auVar94,auVar111,auVar88);
          fVar223 = auVar88._0_4_;
          fVar177 = auVar87._0_4_;
          auVar87 = SUB6416(ZEXT864(0),0);
          if ((fVar223 == fVar177) && (!NAN(fVar223) && !NAN(fVar177))) {
            auVar87 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar223 == fVar177) && (!NAN(fVar223) && !NAN(fVar177))) {
            auVar239 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar88 = vmovshdup_avx(auVar88);
          fVar256 = auVar88._0_4_;
          if ((fVar223 != fVar256) || (NAN(fVar223) || NAN(fVar256))) {
            if ((fVar117 != fVar84) || (NAN(fVar117) || NAN(fVar84))) {
              auVar123._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
              auVar123._8_4_ = auVar59._8_4_ ^ 0x80000000;
              auVar123._12_4_ = auVar59._12_4_ ^ 0x80000000;
              auVar124._0_4_ = -fVar84 / (fVar117 - fVar84);
              auVar124._4_12_ = auVar123._4_12_;
              auVar59 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar124._0_4_)),auVar124,ZEXT416(0));
              auVar88 = auVar59;
            }
            else {
              auVar59 = ZEXT816(0) << 0x20;
              if ((fVar84 != 0.0) || (auVar88 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar84))) {
                auVar59 = SUB6416(ZEXT464(0x7f800000),0);
                auVar88 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar87 = vminss_avx(auVar87,auVar59);
            auVar239 = vmaxss_avx(auVar88,auVar239);
          }
          auVar125 = vcmpss_avx(auVar125,ZEXT416(0),1);
          auVar95._8_4_ = 0x3f800000;
          auVar95._0_8_ = 0x3f8000003f800000;
          auVar95._12_4_ = 0x3f800000;
          auVar112._8_4_ = 0xbf800000;
          auVar112._0_8_ = 0xbf800000bf800000;
          auVar112._12_4_ = 0xbf800000;
          auVar125 = vblendvps_avx(auVar95,auVar112,auVar125);
          fVar117 = auVar125._0_4_;
          if ((fVar177 != fVar117) || (NAN(fVar177) || NAN(fVar117))) {
            if ((fVar57 != fVar81) || (NAN(fVar57) || NAN(fVar81))) {
              auVar69._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
              auVar69._8_4_ = auVar132._8_4_ ^ 0x80000000;
              auVar69._12_4_ = auVar132._12_4_ ^ 0x80000000;
              auVar126._0_4_ = -fVar81 / (fVar57 - fVar81);
              auVar126._4_12_ = auVar69._4_12_;
              auVar125 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
              auVar59 = auVar125;
            }
            else {
              auVar125 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar81 != 0.0) || (auVar59 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar81))) {
                auVar125 = SUB6416(ZEXT464(0xff800000),0);
                auVar59 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar87 = vminss_avx(auVar87,auVar59);
            auVar239 = vmaxss_avx(auVar125,auVar239);
          }
          auVar125 = SUB6416(ZEXT464(0x3f800000),0);
          if ((fVar256 != fVar117) || (NAN(fVar256) || NAN(fVar117))) {
            auVar87 = vminss_avx(auVar87,auVar125);
            auVar239 = vmaxss_avx(auVar125,auVar239);
          }
          auVar87 = vmaxss_avx(ZEXT816(0) << 0x40,auVar87);
          auVar59 = vminss_avx(auVar239,auVar125);
          auVar254 = ZEXT1664(auVar125);
          if (auVar87._0_4_ <= auVar59._0_4_) {
            auVar87 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar87._0_4_ + -0.1)));
            auVar125 = vminss_avx(ZEXT416((uint)(auVar59._0_4_ + 0.1)),auVar125);
            auVar137._0_8_ = auVar86._0_8_;
            auVar137._8_8_ = auVar137._0_8_;
            auVar213._8_8_ = auVar182._0_8_;
            auVar213._0_8_ = auVar182._0_8_;
            auVar227._8_8_ = auVar178._0_8_;
            auVar227._0_8_ = auVar178._0_8_;
            auVar59 = vshufpd_avx(auVar182,auVar182,3);
            auVar88 = vshufpd_avx(auVar178,auVar178,3);
            auVar239 = vshufps_avx(auVar87,auVar125,0);
            auVar70._8_4_ = 0x3f800000;
            auVar70._0_8_ = 0x3f8000003f800000;
            auVar70._12_4_ = 0x3f800000;
            auVar86 = vsubps_avx(auVar70,auVar239);
            fVar117 = auVar239._0_4_;
            auVar71._0_4_ = fVar117 * (float)local_3b8._0_4_;
            fVar81 = auVar239._4_4_;
            auVar71._4_4_ = fVar81 * (float)local_3b8._4_4_;
            fVar57 = auVar239._8_4_;
            auVar71._8_4_ = fVar57 * fStack_3b0;
            fVar84 = auVar239._12_4_;
            auVar71._12_4_ = fVar84 * fStack_3ac;
            auVar171._0_4_ = fVar117 * auVar59._0_4_;
            auVar171._4_4_ = fVar81 * auVar59._4_4_;
            auVar171._8_4_ = fVar57 * auVar59._8_4_;
            auVar171._12_4_ = fVar84 * auVar59._12_4_;
            auVar184._0_4_ = fVar117 * auVar88._0_4_;
            auVar184._4_4_ = fVar81 * auVar88._4_4_;
            auVar184._8_4_ = fVar57 * auVar88._8_4_;
            auVar184._12_4_ = fVar84 * auVar88._12_4_;
            local_4f8._0_4_ = auVar61._0_4_;
            local_4f8._4_4_ = auVar61._4_4_;
            fStack_4f0 = auVar61._8_4_;
            fStack_4ec = auVar61._12_4_;
            auVar202._0_4_ = fVar117 * (float)local_4f8._0_4_;
            auVar202._4_4_ = fVar81 * (float)local_4f8._4_4_;
            auVar202._8_4_ = fVar57 * fStack_4f0;
            auVar202._12_4_ = fVar84 * fStack_4ec;
            auVar88 = vfmadd231ps_fma(auVar71,auVar86,auVar137);
            auVar239 = vfmadd231ps_fma(auVar171,auVar86,auVar213);
            auVar132 = vfmadd231ps_fma(auVar184,auVar86,auVar227);
            auVar86 = vfmadd231ps_fma(auVar202,auVar86,ZEXT816(0));
            auVar61 = vmovshdup_avx(auVar64);
            auVar196 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar87._0_4_)),auVar64,
                                       ZEXT416((uint)(1.0 - auVar87._0_4_)));
            auVar197 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar125._0_4_)),auVar64,
                                       ZEXT416((uint)(1.0 - auVar125._0_4_)));
            fVar117 = 1.0 / fVar58;
            auVar125 = vsubps_avx(auVar239,auVar88);
            auVar214._0_4_ = auVar125._0_4_ * 3.0;
            auVar214._4_4_ = auVar125._4_4_ * 3.0;
            auVar214._8_4_ = auVar125._8_4_ * 3.0;
            auVar214._12_4_ = auVar125._12_4_ * 3.0;
            auVar125 = vsubps_avx(auVar132,auVar239);
            auVar228._0_4_ = auVar125._0_4_ * 3.0;
            auVar228._4_4_ = auVar125._4_4_ * 3.0;
            auVar228._8_4_ = auVar125._8_4_ * 3.0;
            auVar228._12_4_ = auVar125._12_4_ * 3.0;
            auVar125 = vsubps_avx(auVar86,auVar132);
            auVar240._0_4_ = auVar125._0_4_ * 3.0;
            auVar240._4_4_ = auVar125._4_4_ * 3.0;
            auVar240._8_4_ = auVar125._8_4_ * 3.0;
            auVar240._12_4_ = auVar125._12_4_ * 3.0;
            auVar61 = vminps_avx(auVar228,auVar240);
            auVar125 = vmaxps_avx(auVar228,auVar240);
            auVar61 = vminps_avx(auVar214,auVar61);
            auVar125 = vmaxps_avx(auVar214,auVar125);
            auVar87 = vshufpd_avx(auVar61,auVar61,3);
            auVar59 = vshufpd_avx(auVar125,auVar125,3);
            auVar61 = vminps_avx(auVar61,auVar87);
            auVar125 = vmaxps_avx(auVar125,auVar59);
            auVar229._0_4_ = auVar61._0_4_ * fVar117;
            auVar229._4_4_ = auVar61._4_4_ * fVar117;
            auVar229._8_4_ = auVar61._8_4_ * fVar117;
            auVar229._12_4_ = auVar61._12_4_ * fVar117;
            auVar215._0_4_ = auVar125._0_4_ * fVar117;
            auVar215._4_4_ = auVar125._4_4_ * fVar117;
            auVar215._8_4_ = auVar125._8_4_ * fVar117;
            auVar215._12_4_ = auVar125._12_4_ * fVar117;
            fVar117 = 1.0 / (auVar197._0_4_ - auVar196._0_4_);
            auVar125 = vshufpd_avx(auVar88,auVar88,3);
            auVar61 = vshufpd_avx(auVar239,auVar239,3);
            auVar87 = vshufpd_avx(auVar132,auVar132,3);
            auVar59 = vshufpd_avx(auVar86,auVar86,3);
            auVar125 = vsubps_avx(auVar125,auVar88);
            auVar88 = vsubps_avx(auVar61,auVar239);
            auVar239 = vsubps_avx(auVar87,auVar132);
            auVar59 = vsubps_avx(auVar59,auVar86);
            auVar61 = vminps_avx(auVar125,auVar88);
            auVar125 = vmaxps_avx(auVar125,auVar88);
            auVar87 = vminps_avx(auVar239,auVar59);
            auVar87 = vminps_avx(auVar61,auVar87);
            auVar61 = vmaxps_avx(auVar239,auVar59);
            auVar125 = vmaxps_avx(auVar125,auVar61);
            auVar261._0_4_ = fVar117 * auVar87._0_4_;
            auVar261._4_4_ = fVar117 * auVar87._4_4_;
            auVar261._8_4_ = fVar117 * auVar87._8_4_;
            auVar261._12_4_ = fVar117 * auVar87._12_4_;
            auVar247._0_4_ = fVar117 * auVar125._0_4_;
            auVar247._4_4_ = fVar117 * auVar125._4_4_;
            auVar247._8_4_ = fVar117 * auVar125._8_4_;
            auVar247._12_4_ = fVar117 * auVar125._12_4_;
            auVar59 = vinsertps_avx(auVar102,auVar196,0x10);
            auVar88 = vinsertps_avx(auVar128,auVar197,0x10);
            auVar241._0_4_ = (auVar59._0_4_ + auVar88._0_4_) * 0.5;
            auVar241._4_4_ = (auVar59._4_4_ + auVar88._4_4_) * 0.5;
            auVar241._8_4_ = (auVar59._8_4_ + auVar88._8_4_) * 0.5;
            auVar241._12_4_ = (auVar59._12_4_ + auVar88._12_4_) * 0.5;
            auVar72._4_4_ = auVar241._0_4_;
            auVar72._0_4_ = auVar241._0_4_;
            auVar72._8_4_ = auVar241._0_4_;
            auVar72._12_4_ = auVar241._0_4_;
            auVar125 = vfmadd213ps_fma(local_298,auVar72,auVar10);
            auVar61 = vfmadd213ps_fma(local_2a8,auVar72,auVar11);
            auVar87 = vfmadd213ps_fma(local_2b8,auVar72,auVar12);
            auVar128 = vsubps_avx(auVar61,auVar125);
            auVar125 = vfmadd213ps_fma(auVar128,auVar72,auVar125);
            auVar128 = vsubps_avx(auVar87,auVar61);
            auVar128 = vfmadd213ps_fma(auVar128,auVar72,auVar61);
            auVar128 = vsubps_avx(auVar128,auVar125);
            auVar125 = vfmadd231ps_fma(auVar125,auVar128,auVar72);
            auVar73._0_8_ = CONCAT44(auVar128._4_4_ * 3.0,auVar128._0_4_ * 3.0);
            auVar73._8_4_ = auVar128._8_4_ * 3.0;
            auVar73._12_4_ = auVar128._12_4_ * 3.0;
            auVar273._8_8_ = auVar125._0_8_;
            auVar273._0_8_ = auVar125._0_8_;
            auVar128 = vshufpd_avx(auVar125,auVar125,3);
            auVar125 = vshufps_avx(auVar241,auVar241,0x55);
            auVar86 = vsubps_avx(auVar128,auVar273);
            auVar122 = vfmadd231ps_fma(auVar273,auVar125,auVar86);
            auVar280._8_8_ = auVar73._0_8_;
            auVar280._0_8_ = auVar73._0_8_;
            auVar128 = vshufpd_avx(auVar73,auVar73,3);
            auVar128 = vsubps_avx(auVar128,auVar280);
            auVar132 = vfmadd213ps_fma(auVar128,auVar125,auVar280);
            auVar125 = vmovshdup_avx(auVar132);
            auVar281._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
            auVar281._8_4_ = auVar125._8_4_ ^ 0x80000000;
            auVar281._12_4_ = auVar125._12_4_ ^ 0x80000000;
            auVar61 = vmovshdup_avx(auVar86);
            auVar128 = vunpcklps_avx(auVar61,auVar281);
            auVar87 = vshufps_avx(auVar128,auVar281,4);
            auVar239 = vshufps_avx(auVar241,auVar241,0x54);
            auVar127._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar127._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar127._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar128 = vmovlhps_avx(auVar127,auVar132);
            auVar128 = vshufps_avx(auVar128,auVar132,8);
            auVar125 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar125._0_4_)),auVar61,
                                       auVar132);
            uVar56 = auVar125._0_4_;
            auVar74._4_4_ = uVar56;
            auVar74._0_4_ = uVar56;
            auVar74._8_4_ = uVar56;
            auVar74._12_4_ = uVar56;
            auVar125 = vdivps_avx(auVar87,auVar74);
            auVar61 = vdivps_avx(auVar128,auVar74);
            fVar57 = auVar122._0_4_;
            fVar117 = auVar125._0_4_;
            auVar128 = vshufps_avx(auVar122,auVar122,0x55);
            fVar81 = auVar61._0_4_;
            auVar75._0_4_ = fVar57 * fVar117 + auVar128._0_4_ * fVar81;
            auVar75._4_4_ = fVar57 * auVar125._4_4_ + auVar128._4_4_ * auVar61._4_4_;
            auVar75._8_4_ = fVar57 * auVar125._8_4_ + auVar128._8_4_ * auVar61._8_4_;
            auVar75._12_4_ = fVar57 * auVar125._12_4_ + auVar128._12_4_ * auVar61._12_4_;
            auVar178 = vsubps_avx(auVar239,auVar75);
            auVar239 = vmovshdup_avx(auVar125);
            auVar128 = vinsertps_avx(auVar229,auVar261,0x1c);
            auVar150._0_4_ = auVar239._0_4_ * auVar128._0_4_;
            auVar150._4_4_ = auVar239._4_4_ * auVar128._4_4_;
            auVar150._8_4_ = auVar239._8_4_ * auVar128._8_4_;
            auVar150._12_4_ = auVar239._12_4_ * auVar128._12_4_;
            auVar87 = vinsertps_avx(auVar215,auVar247,0x1c);
            auVar96._0_4_ = auVar87._0_4_ * auVar239._0_4_;
            auVar96._4_4_ = auVar87._4_4_ * auVar239._4_4_;
            auVar96._8_4_ = auVar87._8_4_ * auVar239._8_4_;
            auVar96._12_4_ = auVar87._12_4_ * auVar239._12_4_;
            auVar122 = vminps_avx(auVar150,auVar96);
            auVar132 = vmaxps_avx(auVar96,auVar150);
            auVar239 = vinsertps_avx(auVar261,auVar229,0x4c);
            auVar143 = vmovshdup_avx(auVar61);
            auVar86 = vinsertps_avx(auVar247,auVar215,0x4c);
            auVar248._0_4_ = auVar143._0_4_ * auVar239._0_4_;
            auVar248._4_4_ = auVar143._4_4_ * auVar239._4_4_;
            auVar248._8_4_ = auVar143._8_4_ * auVar239._8_4_;
            auVar248._12_4_ = auVar143._12_4_ * auVar239._12_4_;
            auVar230._0_4_ = auVar143._0_4_ * auVar86._0_4_;
            auVar230._4_4_ = auVar143._4_4_ * auVar86._4_4_;
            auVar230._8_4_ = auVar143._8_4_ * auVar86._8_4_;
            auVar230._12_4_ = auVar143._12_4_ * auVar86._12_4_;
            auVar143 = vminps_avx(auVar248,auVar230);
            auVar262._0_4_ = auVar122._0_4_ + auVar143._0_4_;
            auVar262._4_4_ = auVar122._4_4_ + auVar143._4_4_;
            auVar262._8_4_ = auVar122._8_4_ + auVar143._8_4_;
            auVar262._12_4_ = auVar122._12_4_ + auVar143._12_4_;
            auVar122 = vmaxps_avx(auVar230,auVar248);
            auVar97._0_4_ = auVar122._0_4_ + auVar132._0_4_;
            auVar97._4_4_ = auVar122._4_4_ + auVar132._4_4_;
            auVar97._8_4_ = auVar122._8_4_ + auVar132._8_4_;
            auVar97._12_4_ = auVar122._12_4_ + auVar132._12_4_;
            auVar231._8_8_ = 0x3f80000000000000;
            auVar231._0_8_ = 0x3f80000000000000;
            auVar132 = vsubps_avx(auVar231,auVar97);
            auVar122 = vsubps_avx(auVar231,auVar262);
            auVar143 = vsubps_avx(auVar59,auVar241);
            auVar144 = vsubps_avx(auVar88,auVar241);
            auVar113._0_4_ = fVar117 * auVar128._0_4_;
            auVar113._4_4_ = fVar117 * auVar128._4_4_;
            auVar113._8_4_ = fVar117 * auVar128._8_4_;
            auVar113._12_4_ = fVar117 * auVar128._12_4_;
            auVar263._0_4_ = fVar117 * auVar87._0_4_;
            auVar263._4_4_ = fVar117 * auVar87._4_4_;
            auVar263._8_4_ = fVar117 * auVar87._8_4_;
            auVar263._12_4_ = fVar117 * auVar87._12_4_;
            auVar87 = vminps_avx(auVar113,auVar263);
            auVar128 = vmaxps_avx(auVar263,auVar113);
            auVar151._0_4_ = fVar81 * auVar239._0_4_;
            auVar151._4_4_ = fVar81 * auVar239._4_4_;
            auVar151._8_4_ = fVar81 * auVar239._8_4_;
            auVar151._12_4_ = fVar81 * auVar239._12_4_;
            auVar216._0_4_ = fVar81 * auVar86._0_4_;
            auVar216._4_4_ = fVar81 * auVar86._4_4_;
            auVar216._8_4_ = fVar81 * auVar86._8_4_;
            auVar216._12_4_ = fVar81 * auVar86._12_4_;
            auVar239 = vminps_avx(auVar151,auVar216);
            auVar264._0_4_ = auVar87._0_4_ + auVar239._0_4_;
            auVar264._4_4_ = auVar87._4_4_ + auVar239._4_4_;
            auVar264._8_4_ = auVar87._8_4_ + auVar239._8_4_;
            auVar264._12_4_ = auVar87._12_4_ + auVar239._12_4_;
            fVar256 = auVar143._0_4_;
            auVar274._0_4_ = fVar256 * auVar132._0_4_;
            fVar257 = auVar143._4_4_;
            auVar274._4_4_ = fVar257 * auVar132._4_4_;
            fVar190 = auVar143._8_4_;
            auVar274._8_4_ = fVar190 * auVar132._8_4_;
            fVar191 = auVar143._12_4_;
            auVar274._12_4_ = fVar191 * auVar132._12_4_;
            auVar87 = vmaxps_avx(auVar216,auVar151);
            auVar217._0_4_ = fVar256 * auVar122._0_4_;
            auVar217._4_4_ = fVar257 * auVar122._4_4_;
            auVar217._8_4_ = fVar190 * auVar122._8_4_;
            auVar217._12_4_ = fVar191 * auVar122._12_4_;
            fVar57 = auVar144._0_4_;
            auVar98._0_4_ = fVar57 * auVar132._0_4_;
            fVar84 = auVar144._4_4_;
            auVar98._4_4_ = fVar84 * auVar132._4_4_;
            fVar177 = auVar144._8_4_;
            auVar98._8_4_ = fVar177 * auVar132._8_4_;
            fVar223 = auVar144._12_4_;
            auVar98._12_4_ = fVar223 * auVar132._12_4_;
            auVar232._0_4_ = fVar57 * auVar122._0_4_;
            auVar232._4_4_ = fVar84 * auVar122._4_4_;
            auVar232._8_4_ = fVar177 * auVar122._8_4_;
            auVar232._12_4_ = fVar223 * auVar122._12_4_;
            auVar114._0_4_ = auVar128._0_4_ + auVar87._0_4_;
            auVar114._4_4_ = auVar128._4_4_ + auVar87._4_4_;
            auVar114._8_4_ = auVar128._8_4_ + auVar87._8_4_;
            auVar114._12_4_ = auVar128._12_4_ + auVar87._12_4_;
            auVar152._8_8_ = 0x3f800000;
            auVar152._0_8_ = 0x3f800000;
            auVar128 = vsubps_avx(auVar152,auVar114);
            auVar87 = vsubps_avx(auVar152,auVar264);
            auVar265._0_4_ = fVar256 * auVar128._0_4_;
            auVar265._4_4_ = fVar257 * auVar128._4_4_;
            auVar265._8_4_ = fVar190 * auVar128._8_4_;
            auVar265._12_4_ = fVar191 * auVar128._12_4_;
            auVar249._0_4_ = fVar256 * auVar87._0_4_;
            auVar249._4_4_ = fVar257 * auVar87._4_4_;
            auVar249._8_4_ = fVar190 * auVar87._8_4_;
            auVar249._12_4_ = fVar191 * auVar87._12_4_;
            auVar115._0_4_ = fVar57 * auVar128._0_4_;
            auVar115._4_4_ = fVar84 * auVar128._4_4_;
            auVar115._8_4_ = fVar177 * auVar128._8_4_;
            auVar115._12_4_ = fVar223 * auVar128._12_4_;
            auVar153._0_4_ = fVar57 * auVar87._0_4_;
            auVar153._4_4_ = fVar84 * auVar87._4_4_;
            auVar153._8_4_ = fVar177 * auVar87._8_4_;
            auVar153._12_4_ = fVar223 * auVar87._12_4_;
            auVar128 = vminps_avx(auVar265,auVar249);
            auVar87 = vminps_avx(auVar115,auVar153);
            auVar128 = vminps_avx(auVar128,auVar87);
            auVar87 = vmaxps_avx(auVar249,auVar265);
            auVar239 = vmaxps_avx(auVar153,auVar115);
            auVar86 = vminps_avx(auVar274,auVar217);
            auVar132 = vminps_avx(auVar98,auVar232);
            auVar86 = vminps_avx(auVar86,auVar132);
            auVar128 = vhaddps_avx(auVar128,auVar86);
            auVar87 = vmaxps_avx(auVar239,auVar87);
            auVar254 = ZEXT464(0x3f800000);
            auVar239 = vmaxps_avx(auVar217,auVar274);
            auVar86 = vmaxps_avx(auVar232,auVar98);
            auVar239 = vmaxps_avx(auVar86,auVar239);
            auVar87 = vhaddps_avx(auVar87,auVar239);
            auVar128 = vshufps_avx(auVar128,auVar128,0xe8);
            auVar87 = vshufps_avx(auVar87,auVar87,0xe8);
            auVar233._0_4_ = auVar178._0_4_ + auVar128._0_4_;
            auVar233._4_4_ = auVar178._4_4_ + auVar128._4_4_;
            auVar233._8_4_ = auVar178._8_4_ + auVar128._8_4_;
            auVar233._12_4_ = auVar178._12_4_ + auVar128._12_4_;
            auVar218._0_4_ = auVar178._0_4_ + auVar87._0_4_;
            auVar218._4_4_ = auVar178._4_4_ + auVar87._4_4_;
            auVar218._8_4_ = auVar178._8_4_ + auVar87._8_4_;
            auVar218._12_4_ = auVar178._12_4_ + auVar87._12_4_;
            auVar221 = ZEXT1664(auVar218);
            auVar128 = vmaxps_avx(auVar59,auVar233);
            auVar87 = vminps_avx(auVar218,auVar88);
            auVar128 = vcmpps_avx(auVar87,auVar128,1);
            auVar128 = vshufps_avx(auVar128,auVar128,0x50);
            if ((auVar128 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar128[0xf]) {
              bVar49 = 0;
              if ((fVar83 < auVar233._0_4_) && (bVar49 = 0, auVar218._0_4_ < auVar88._0_4_)) {
                auVar87 = vmovshdup_avx(auVar233);
                auVar128 = vcmpps_avx(auVar218,auVar88,1);
                bVar49 = auVar128[4] & auVar196._0_4_ < auVar87._0_4_;
              }
              if (((3 < uVar54 || fVar58 < 0.001) | bVar49) != 1) goto LAB_01626cc0;
              lVar48 = 200;
              do {
                fVar57 = auVar178._0_4_;
                fVar83 = 1.0 - fVar57;
                fVar58 = fVar83 * fVar83 * fVar83;
                fVar82 = fVar57 * 3.0 * fVar83 * fVar83;
                fVar83 = fVar83 * fVar57 * fVar57 * 3.0;
                auVar138._4_4_ = fVar58;
                auVar138._0_4_ = fVar58;
                auVar138._8_4_ = fVar58;
                auVar138._12_4_ = fVar58;
                auVar116._4_4_ = fVar82;
                auVar116._0_4_ = fVar82;
                auVar116._8_4_ = fVar82;
                auVar116._12_4_ = fVar82;
                auVar99._4_4_ = fVar83;
                auVar99._0_4_ = fVar83;
                auVar99._8_4_ = fVar83;
                auVar99._12_4_ = fVar83;
                fVar57 = fVar57 * fVar57 * fVar57;
                auVar154._0_4_ = fVar57 * (float)local_278._0_4_;
                auVar154._4_4_ = fVar57 * (float)local_278._4_4_;
                auVar154._8_4_ = fVar57 * fStack_270;
                auVar154._12_4_ = fVar57 * fStack_26c;
                auVar102 = vfmadd231ps_fma(auVar154,auVar99,auVar12);
                auVar102 = vfmadd231ps_fma(auVar102,auVar116,auVar11);
                auVar102 = vfmadd231ps_fma(auVar102,auVar138,auVar10);
                auVar100._8_8_ = auVar102._0_8_;
                auVar100._0_8_ = auVar102._0_8_;
                auVar102 = vshufpd_avx(auVar102,auVar102,3);
                auVar128 = vshufps_avx(auVar178,auVar178,0x55);
                auVar102 = vsubps_avx(auVar102,auVar100);
                auVar128 = vfmadd213ps_fma(auVar102,auVar128,auVar100);
                fVar58 = auVar128._0_4_;
                auVar102 = vshufps_avx(auVar128,auVar128,0x55);
                auVar101._0_4_ = fVar117 * fVar58 + fVar81 * auVar102._0_4_;
                auVar101._4_4_ = auVar125._4_4_ * fVar58 + auVar61._4_4_ * auVar102._4_4_;
                auVar101._8_4_ = auVar125._8_4_ * fVar58 + auVar61._8_4_ * auVar102._8_4_;
                auVar101._12_4_ = auVar125._12_4_ * fVar58 + auVar61._12_4_ * auVar102._12_4_;
                auVar178 = vsubps_avx(auVar178,auVar101);
                auVar102 = vandps_avx(local_3f8,auVar128);
                auVar128 = vshufps_avx(auVar102,auVar102,0xf5);
                auVar102 = vmaxss_avx(auVar128,auVar102);
                if (auVar102._0_4_ < (float)local_288._0_4_) {
                  fVar58 = auVar178._0_4_;
                  if ((0.0 <= fVar58) && (fVar58 <= 1.0)) {
                    auVar102 = vmovshdup_avx(auVar178);
                    fVar82 = auVar102._0_4_;
                    if ((0.0 <= fVar82) && (fVar82 <= 1.0)) {
                      auVar102 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar239 = vinsertps_avx(auVar102,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar102 = vdpps_avx(auVar239,local_408,0x7f);
                      auVar128 = vdpps_avx(auVar239,local_418,0x7f);
                      auVar125 = vdpps_avx(auVar239,local_2c8,0x7f);
                      auVar61 = vdpps_avx(auVar239,local_2d8,0x7f);
                      auVar87 = vdpps_avx(auVar239,local_2e8,0x7f);
                      auVar59 = vdpps_avx(auVar239,local_2f8,0x7f);
                      auVar88 = vdpps_avx(auVar239,local_308,0x7f);
                      auVar239 = vdpps_avx(auVar239,local_318,0x7f);
                      fVar83 = 1.0 - fVar82;
                      auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * auVar87._0_4_)),
                                                 ZEXT416((uint)fVar83),auVar102);
                      auVar128 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar82)),
                                                 ZEXT416((uint)fVar83),auVar128);
                      auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ * fVar82)),
                                                 ZEXT416((uint)fVar83),auVar125);
                      auVar221 = ZEXT1664(auVar125);
                      auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * auVar239._0_4_)),
                                                ZEXT416((uint)fVar83),auVar61);
                      fVar57 = 1.0 - fVar58;
                      fVar83 = fVar57 * fVar58 * fVar58 * 3.0;
                      fVar177 = fVar58 * fVar58 * fVar58;
                      auVar125 = vfmadd231ss_fma(ZEXT416((uint)(fVar177 * auVar61._0_4_)),
                                                 ZEXT416((uint)fVar83),auVar125);
                      fVar117 = fVar58 * 3.0 * fVar57 * fVar57;
                      auVar128 = vfmadd231ss_fma(auVar125,ZEXT416((uint)fVar117),auVar128);
                      fVar81 = fVar57 * fVar57 * fVar57;
                      auVar102 = vfmadd231ss_fma(auVar128,ZEXT416((uint)fVar81),auVar102);
                      fVar84 = auVar102._0_4_;
                      if (((fVar55 <= fVar84) &&
                          (fVar223 = *(float *)(ray + k * 4 + 0x80), fVar84 <= fVar223)) &&
                         (pGVar5 = (context->scene->geometries).items[uVar46].ptr,
                         (pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                        auVar102 = vshufps_avx(auVar178,auVar178,0x55);
                        auVar219._8_4_ = 0x3f800000;
                        auVar219._0_8_ = 0x3f8000003f800000;
                        auVar219._12_4_ = 0x3f800000;
                        auVar128 = vsubps_avx(auVar219,auVar102);
                        fVar256 = auVar102._0_4_;
                        auVar234._0_4_ = fVar256 * (float)local_438._0_4_;
                        fVar257 = auVar102._4_4_;
                        auVar234._4_4_ = fVar257 * (float)local_438._4_4_;
                        fVar190 = auVar102._8_4_;
                        auVar234._8_4_ = fVar190 * fStack_430;
                        fVar191 = auVar102._12_4_;
                        auVar234._12_4_ = fVar191 * fStack_42c;
                        auVar242._0_4_ = fVar256 * (float)local_478._0_4_;
                        auVar242._4_4_ = fVar257 * (float)local_478._4_4_;
                        auVar242._8_4_ = fVar190 * fStack_470;
                        auVar242._12_4_ = fVar191 * fStack_46c;
                        auVar250._0_4_ = fVar256 * (float)local_488._0_4_;
                        auVar250._4_4_ = fVar257 * (float)local_488._4_4_;
                        auVar250._8_4_ = fVar190 * fStack_480;
                        auVar250._12_4_ = fVar191 * fStack_47c;
                        auVar266._0_4_ = fVar256 * fVar157;
                        auVar266._4_4_ = fVar257 * fVar174;
                        auVar266._8_4_ = fVar190 * fVar175;
                        auVar266._12_4_ = fVar191 * fVar176;
                        auVar125 = vfmadd231ps_fma(auVar234,auVar128,local_428);
                        auVar61 = vfmadd231ps_fma(auVar242,auVar128,local_458);
                        auVar87 = vfmadd231ps_fma(auVar250,auVar128,local_468);
                        auVar59 = vfmadd231ps_fma(auVar266,auVar128,local_448);
                        auVar128 = vsubps_avx(auVar61,auVar125);
                        auVar125 = vsubps_avx(auVar87,auVar61);
                        auVar61 = vsubps_avx(auVar59,auVar87);
                        local_218._4_4_ = fVar58;
                        local_218._0_4_ = fVar58;
                        local_218._8_4_ = fVar58;
                        local_218._12_4_ = fVar58;
                        auVar221 = ZEXT1664(local_218);
                        auVar267._0_4_ = fVar58 * auVar125._0_4_;
                        auVar267._4_4_ = fVar58 * auVar125._4_4_;
                        auVar267._8_4_ = fVar58 * auVar125._8_4_;
                        auVar267._12_4_ = fVar58 * auVar125._12_4_;
                        auVar203._4_4_ = fVar57;
                        auVar203._0_4_ = fVar57;
                        auVar203._8_4_ = fVar57;
                        auVar203._12_4_ = fVar57;
                        auVar128 = vfmadd231ps_fma(auVar267,auVar203,auVar128);
                        auVar235._0_4_ = fVar58 * auVar61._0_4_;
                        auVar235._4_4_ = fVar58 * auVar61._4_4_;
                        auVar235._8_4_ = fVar58 * auVar61._8_4_;
                        auVar235._12_4_ = fVar58 * auVar61._12_4_;
                        auVar125 = vfmadd231ps_fma(auVar235,auVar203,auVar125);
                        auVar236._0_4_ = fVar58 * auVar125._0_4_;
                        auVar236._4_4_ = fVar58 * auVar125._4_4_;
                        auVar236._8_4_ = fVar58 * auVar125._8_4_;
                        auVar236._12_4_ = fVar58 * auVar125._12_4_;
                        auVar125 = vfmadd231ps_fma(auVar236,auVar203,auVar128);
                        auVar185._0_4_ = fVar177 * (float)local_368._0_4_;
                        auVar185._4_4_ = fVar177 * (float)local_368._4_4_;
                        auVar185._8_4_ = fVar177 * fStack_360;
                        auVar185._12_4_ = fVar177 * fStack_35c;
                        auVar139._4_4_ = fVar83;
                        auVar139._0_4_ = fVar83;
                        auVar139._8_4_ = fVar83;
                        auVar139._12_4_ = fVar83;
                        auVar128 = vfmadd132ps_fma(auVar139,auVar185,local_358);
                        auVar172._4_4_ = fVar117;
                        auVar172._0_4_ = fVar117;
                        auVar172._8_4_ = fVar117;
                        auVar172._12_4_ = fVar117;
                        auVar128 = vfmadd132ps_fma(auVar172,auVar128,local_348);
                        auVar186._0_4_ = auVar125._0_4_ * 3.0;
                        auVar186._4_4_ = auVar125._4_4_ * 3.0;
                        auVar186._8_4_ = auVar125._8_4_ * 3.0;
                        auVar186._12_4_ = auVar125._12_4_ * 3.0;
                        auVar155._4_4_ = fVar81;
                        auVar155._0_4_ = fVar81;
                        auVar155._8_4_ = fVar81;
                        auVar155._12_4_ = fVar81;
                        auVar125 = vfmadd132ps_fma(auVar155,auVar128,local_338);
                        auVar128 = vshufps_avx(auVar186,auVar186,0xc9);
                        auVar140._0_4_ = auVar125._0_4_ * auVar128._0_4_;
                        auVar140._4_4_ = auVar125._4_4_ * auVar128._4_4_;
                        auVar140._8_4_ = auVar125._8_4_ * auVar128._8_4_;
                        auVar140._12_4_ = auVar125._12_4_ * auVar128._12_4_;
                        auVar128 = vshufps_avx(auVar125,auVar125,0xc9);
                        auVar128 = vfmsub231ps_fma(auVar140,auVar186,auVar128);
                        local_228 = auVar128._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar84;
                          uVar56 = vextractps_avx(auVar128,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar56;
                          uVar56 = vextractps_avx(auVar128,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar56;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                          *(float *)(ray + k * 4 + 0xf0) = fVar58;
                          *(float *)(ray + k * 4 + 0x100) = fVar82;
                          *(uint *)(ray + k * 4 + 0x110) = uVar4;
                          *(uint *)(ray + k * 4 + 0x120) = uVar46;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          auVar254 = ZEXT464(0x3f800000);
                        }
                        else {
                          auVar125 = vshufps_avx(auVar128,auVar128,0x55);
                          auVar128 = vshufps_avx(auVar128,auVar128,0xaa);
                          local_248[0] = (RTCHitN)auVar125[0];
                          local_248[1] = (RTCHitN)auVar125[1];
                          local_248[2] = (RTCHitN)auVar125[2];
                          local_248[3] = (RTCHitN)auVar125[3];
                          local_248[4] = (RTCHitN)auVar125[4];
                          local_248[5] = (RTCHitN)auVar125[5];
                          local_248[6] = (RTCHitN)auVar125[6];
                          local_248[7] = (RTCHitN)auVar125[7];
                          local_248[8] = (RTCHitN)auVar125[8];
                          local_248[9] = (RTCHitN)auVar125[9];
                          local_248[10] = (RTCHitN)auVar125[10];
                          local_248[0xb] = (RTCHitN)auVar125[0xb];
                          local_248[0xc] = (RTCHitN)auVar125[0xc];
                          local_248[0xd] = (RTCHitN)auVar125[0xd];
                          local_248[0xe] = (RTCHitN)auVar125[0xe];
                          local_248[0xf] = (RTCHitN)auVar125[0xf];
                          local_238 = auVar128;
                          uStack_224 = local_228;
                          uStack_220 = local_228;
                          uStack_21c = local_228;
                          local_208 = auVar102;
                          local_1f8 = CONCAT44(uStack_394,local_398);
                          uStack_1f0 = CONCAT44(uStack_38c,uStack_390);
                          local_1e8._4_4_ = uStack_384;
                          local_1e8._0_4_ = local_388;
                          local_1e8._8_4_ = uStack_380;
                          local_1e8._12_4_ = uStack_37c;
                          vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                          uStack_1d4 = context->user->instID[0];
                          local_1d8 = uStack_1d4;
                          uStack_1d0 = uStack_1d4;
                          uStack_1cc = uStack_1d4;
                          uStack_1c8 = context->user->instPrimID[0];
                          uStack_1c4 = uStack_1c8;
                          uStack_1c0 = uStack_1c8;
                          uStack_1bc = uStack_1c8;
                          *(float *)(ray + k * 4 + 0x80) = fVar84;
                          local_518 = *local_500;
                          local_4b8.valid = (int *)local_518;
                          local_4b8.geometryUserPtr = pGVar5->userPtr;
                          local_4b8.context = context->user;
                          local_4b8.hit = local_248;
                          local_4b8.N = 4;
                          local_4b8.ray = (RTCRayN *)ray;
                          if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar221 = ZEXT1664(local_218);
                            (*pGVar5->intersectionFilterN)(&local_4b8);
                            auVar254._8_56_ = extraout_var;
                            auVar254._0_8_ = extraout_XMM1_Qa;
                            auVar128 = auVar254._0_16_;
                          }
                          if (local_518 == (undefined1  [16])0x0) {
                            auVar102 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar128 = vpcmpeqd_avx(auVar128,auVar128);
                            auVar102 = auVar102 ^ auVar128;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            auVar128 = vpcmpeqd_avx(auVar102,auVar102);
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar221 = ZEXT1664(auVar221._0_16_);
                              (*p_Var6)(&local_4b8);
                              auVar128 = vpcmpeqd_avx(auVar128,auVar128);
                            }
                            auVar125 = vpcmpeqd_avx(local_518,_DAT_01f7aa10);
                            auVar102 = auVar125 ^ auVar128;
                            if (local_518 != (undefined1  [16])0x0) {
                              auVar125 = auVar125 ^ auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])local_4b8.hit
                                                       );
                              *(undefined1 (*) [16])(local_4b8.ray + 0xc0) = auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x10));
                              *(undefined1 (*) [16])(local_4b8.ray + 0xd0) = auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x20));
                              *(undefined1 (*) [16])(local_4b8.ray + 0xe0) = auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x30));
                              *(undefined1 (*) [16])(local_4b8.ray + 0xf0) = auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x40));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x100) = auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x50));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x110) = auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x60));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x120) = auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x70));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x130) = auVar128;
                              auVar128 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x80));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x140) = auVar128;
                            }
                          }
                          auVar254 = ZEXT464(0x3f800000);
                          auVar76._8_8_ = 0x100000001;
                          auVar76._0_8_ = 0x100000001;
                          if ((auVar76 & auVar102) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar223;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar48 = lVar48 + -1;
              } while (lVar48 != 0);
            }
          }
        }
        else {
          auVar87 = vcmpps_avx(auVar87,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar88 = vcmpps_avx(auVar59,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar87 = vandps_avx(auVar88,auVar87);
          if (-0.0001 < fVar81 && (auVar87 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_01626042;
        }
        if (uVar54 == 0) break;
      } while( true );
    }
    uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar77._4_4_ = uVar56;
    auVar77._0_4_ = uVar56;
    auVar77._8_4_ = uVar56;
    auVar77._12_4_ = uVar56;
    auVar102 = vcmpps_avx(local_378,auVar77,2);
    uVar46 = vmovmskps_avx(auVar102);
    uVar46 = (uint)uVar52 & uVar46;
    if (uVar46 == 0) {
      return;
    }
  } while( true );
LAB_01626cc0:
  local_328 = vinsertps_avx(auVar102,ZEXT416((uint)fVar82),0x10);
  auVar64 = vinsertps_avx(auVar196,ZEXT416((uint)auVar197._0_4_),0x10);
  goto LAB_01625796;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }